

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  ulong uVar26;
  undefined8 uVar27;
  long lVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  undefined1 auVar75 [32];
  Geometry *pGVar76;
  byte bVar77;
  ulong uVar78;
  uint uVar79;
  uint uVar80;
  long lVar81;
  long lVar82;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  Geometry *pGVar83;
  uint uVar84;
  ulong uVar85;
  byte bVar86;
  ulong uVar87;
  float fVar88;
  float fVar89;
  float fVar140;
  float fVar142;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar97 [16];
  float fVar141;
  float fVar143;
  float fVar145;
  float fVar146;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar98 [16];
  float fVar144;
  float fVar147;
  float fVar148;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar149;
  float fVar150;
  undefined1 auVar152 [16];
  undefined4 uVar151;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar172 [16];
  undefined8 uVar171;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar175;
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar230 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  RTCFilterFunctionNArguments local_660;
  Geometry *local_630;
  undefined1 (*local_628) [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar224 [32];
  
  PVar12 = prim[1];
  uVar78 = (ulong)(byte)PVar12;
  lVar28 = uVar78 * 0x25;
  fVar176 = *(float *)(prim + lVar28 + 0x12);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar152 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar172 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + lVar28 + 6));
  fVar183 = fVar176 * auVar172._0_4_;
  fVar149 = fVar176 * auVar152._0_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar91);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar114 = vpmovsxbd_avx2(auVar94);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar78 * 0xf + 6);
  auVar113 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar108 = vpmovsxbd_avx2(auVar7);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar104 = vcvtdq2ps_avx(auVar108);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar78 + 6);
  auVar105 = vpmovsxbd_avx2(auVar8);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar78 * 0x1a + 6);
  auVar112 = vpmovsxbd_avx2(auVar9);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar78 * 0x1b + 6);
  auVar106 = vpmovsxbd_avx2(auVar10);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar78 * 0x1c + 6);
  auVar101 = vpmovsxbd_avx2(auVar11);
  auVar107 = vcvtdq2ps_avx(auVar101);
  auVar203._4_4_ = fVar149;
  auVar203._0_4_ = fVar149;
  auVar203._8_4_ = fVar149;
  auVar203._12_4_ = fVar149;
  auVar203._16_4_ = fVar149;
  auVar203._20_4_ = fVar149;
  auVar203._24_4_ = fVar149;
  auVar203._28_4_ = fVar149;
  auVar222._8_4_ = 1;
  auVar222._0_8_ = 0x100000001;
  auVar222._12_4_ = 1;
  auVar222._16_4_ = 1;
  auVar222._20_4_ = 1;
  auVar222._24_4_ = 1;
  auVar222._28_4_ = 1;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar110 = ZEXT1632(CONCAT412(fVar176 * auVar152._12_4_,
                                CONCAT48(fVar176 * auVar152._8_4_,
                                         CONCAT44(fVar176 * auVar152._4_4_,fVar149))));
  auVar109 = vpermps_avx2(auVar222,auVar110);
  auVar100 = vpermps_avx512vl(auVar99,auVar110);
  fVar150 = auVar100._0_4_;
  fVar166 = auVar100._4_4_;
  auVar110._4_4_ = fVar166 * auVar114._4_4_;
  auVar110._0_4_ = fVar150 * auVar114._0_4_;
  fVar167 = auVar100._8_4_;
  auVar110._8_4_ = fVar167 * auVar114._8_4_;
  fVar168 = auVar100._12_4_;
  auVar110._12_4_ = fVar168 * auVar114._12_4_;
  fVar169 = auVar100._16_4_;
  auVar110._16_4_ = fVar169 * auVar114._16_4_;
  fVar170 = auVar100._20_4_;
  auVar110._20_4_ = fVar170 * auVar114._20_4_;
  fVar175 = auVar100._24_4_;
  auVar110._24_4_ = fVar175 * auVar114._24_4_;
  auVar110._28_4_ = auVar108._28_4_;
  auVar108._4_4_ = auVar105._4_4_ * fVar166;
  auVar108._0_4_ = auVar105._0_4_ * fVar150;
  auVar108._8_4_ = auVar105._8_4_ * fVar167;
  auVar108._12_4_ = auVar105._12_4_ * fVar168;
  auVar108._16_4_ = auVar105._16_4_ * fVar169;
  auVar108._20_4_ = auVar105._20_4_ * fVar170;
  auVar108._24_4_ = auVar105._24_4_ * fVar175;
  auVar108._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar107._4_4_ * fVar166;
  auVar101._0_4_ = auVar107._0_4_ * fVar150;
  auVar101._8_4_ = auVar107._8_4_ * fVar167;
  auVar101._12_4_ = auVar107._12_4_ * fVar168;
  auVar101._16_4_ = auVar107._16_4_ * fVar169;
  auVar101._20_4_ = auVar107._20_4_ * fVar170;
  auVar101._24_4_ = auVar107._24_4_ * fVar175;
  auVar101._28_4_ = auVar100._28_4_;
  auVar90 = vfmadd231ps_fma(auVar110,auVar109,auVar102);
  auVar91 = vfmadd231ps_fma(auVar108,auVar109,auVar104);
  auVar94 = vfmadd231ps_fma(auVar101,auVar106,auVar109);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar203,auVar103);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar203,auVar113);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar112,auVar203);
  auVar220._4_4_ = fVar183;
  auVar220._0_4_ = fVar183;
  auVar220._8_4_ = fVar183;
  auVar220._12_4_ = fVar183;
  auVar220._16_4_ = fVar183;
  auVar220._20_4_ = fVar183;
  auVar220._24_4_ = fVar183;
  auVar220._28_4_ = fVar183;
  auVar101 = ZEXT1632(CONCAT412(fVar176 * auVar172._12_4_,
                                CONCAT48(fVar176 * auVar172._8_4_,
                                         CONCAT44(fVar176 * auVar172._4_4_,fVar183))));
  auVar108 = vpermps_avx2(auVar222,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  fVar176 = auVar101._0_4_;
  fVar150 = auVar101._4_4_;
  auVar109._4_4_ = fVar150 * auVar114._4_4_;
  auVar109._0_4_ = fVar176 * auVar114._0_4_;
  fVar166 = auVar101._8_4_;
  auVar109._8_4_ = fVar166 * auVar114._8_4_;
  fVar167 = auVar101._12_4_;
  auVar109._12_4_ = fVar167 * auVar114._12_4_;
  fVar168 = auVar101._16_4_;
  auVar109._16_4_ = fVar168 * auVar114._16_4_;
  fVar169 = auVar101._20_4_;
  auVar109._20_4_ = fVar169 * auVar114._20_4_;
  fVar170 = auVar101._24_4_;
  auVar109._24_4_ = fVar170 * auVar114._24_4_;
  auVar109._28_4_ = fVar149;
  auVar99._4_4_ = auVar105._4_4_ * fVar150;
  auVar99._0_4_ = auVar105._0_4_ * fVar176;
  auVar99._8_4_ = auVar105._8_4_ * fVar166;
  auVar99._12_4_ = auVar105._12_4_ * fVar167;
  auVar99._16_4_ = auVar105._16_4_ * fVar168;
  auVar99._20_4_ = auVar105._20_4_ * fVar169;
  auVar99._24_4_ = auVar105._24_4_ * fVar170;
  auVar99._28_4_ = auVar114._28_4_;
  auVar105._4_4_ = auVar107._4_4_ * fVar150;
  auVar105._0_4_ = auVar107._0_4_ * fVar176;
  auVar105._8_4_ = auVar107._8_4_ * fVar166;
  auVar105._12_4_ = auVar107._12_4_ * fVar167;
  auVar105._16_4_ = auVar107._16_4_ * fVar168;
  auVar105._20_4_ = auVar107._20_4_ * fVar169;
  auVar105._24_4_ = auVar107._24_4_ * fVar170;
  auVar105._28_4_ = auVar101._28_4_;
  auVar6 = vfmadd231ps_fma(auVar109,auVar108,auVar102);
  auVar7 = vfmadd231ps_fma(auVar99,auVar108,auVar104);
  auVar8 = vfmadd231ps_fma(auVar105,auVar108,auVar106);
  auVar152 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar220,auVar103);
  auVar172 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar220,auVar113);
  auVar212._8_4_ = 0x7fffffff;
  auVar212._0_8_ = 0x7fffffff7fffffff;
  auVar212._12_4_ = 0x7fffffff;
  auVar212._16_4_ = 0x7fffffff;
  auVar212._20_4_ = 0x7fffffff;
  auVar212._24_4_ = 0x7fffffff;
  auVar212._28_4_ = 0x7fffffff;
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar220,auVar112);
  auVar103 = vandps_avx(auVar212,ZEXT1632(auVar90));
  auVar208._8_4_ = 0x219392ef;
  auVar208._0_8_ = 0x219392ef219392ef;
  auVar208._12_4_ = 0x219392ef;
  auVar208._16_4_ = 0x219392ef;
  auVar208._20_4_ = 0x219392ef;
  auVar208._24_4_ = 0x219392ef;
  auVar208._28_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar103,auVar208,1);
  bVar19 = (bool)((byte)uVar85 & 1);
  auVar100._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar90._0_4_;
  bVar19 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar90._4_4_;
  bVar19 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar90._8_4_;
  bVar19 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar90._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(auVar212,ZEXT1632(auVar91));
  uVar85 = vcmpps_avx512vl(auVar103,auVar208,1);
  bVar19 = (bool)((byte)uVar85 & 1);
  auVar111._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar91._0_4_;
  bVar19 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar91._4_4_;
  bVar19 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar91._8_4_;
  bVar19 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar91._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(auVar212,ZEXT1632(auVar94));
  uVar85 = vcmpps_avx512vl(auVar103,auVar208,1);
  bVar19 = (bool)((byte)uVar85 & 1);
  auVar103._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar94._0_4_;
  bVar19 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar94._4_4_;
  bVar19 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar94._8_4_;
  bVar19 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar94._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar209._8_4_ = 0x3f800000;
  auVar209._0_8_ = 0x3f8000003f800000;
  auVar209._12_4_ = 0x3f800000;
  auVar209._16_4_ = 0x3f800000;
  auVar209._20_4_ = 0x3f800000;
  auVar209._24_4_ = 0x3f800000;
  auVar209._28_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar100,auVar102,auVar209);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar111);
  auVar91 = vfnmadd213ps_fma(auVar111,auVar102,auVar209);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar103);
  auVar94 = vfnmadd213ps_fma(auVar103,auVar102,auVar209);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar102,auVar102);
  fVar176 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar28 + 0x16)) *
            *(float *)(prim + lVar28 + 0x1a);
  auVar207._4_4_ = fVar176;
  auVar207._0_4_ = fVar176;
  auVar207._8_4_ = fVar176;
  auVar207._12_4_ = fVar176;
  auVar207._16_4_ = fVar176;
  auVar207._20_4_ = fVar176;
  auVar207._24_4_ = fVar176;
  auVar207._28_4_ = fVar176;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0xb + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar102,auVar207,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar114);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0xd + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar7 = vfmadd213ps_fma(auVar102,auVar207,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x12 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar85 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 2 + uVar85 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar8 = vfmadd213ps_fma(auVar102,auVar207,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x18 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar9 = vfmadd213ps_fma(auVar102,auVar207,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x1d + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar10 = vfmadd213ps_fma(auVar102,auVar207,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar78) + 6)
                           );
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x23 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar11 = vfmadd213ps_fma(auVar102,auVar207,auVar103);
  auVar103 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar152));
  auVar112._4_4_ = auVar90._4_4_ * auVar103._4_4_;
  auVar112._0_4_ = auVar90._0_4_ * auVar103._0_4_;
  auVar112._8_4_ = auVar90._8_4_ * auVar103._8_4_;
  auVar112._12_4_ = auVar90._12_4_ * auVar103._12_4_;
  auVar112._16_4_ = auVar103._16_4_ * 0.0;
  auVar112._20_4_ = auVar103._20_4_ * 0.0;
  auVar112._24_4_ = auVar103._24_4_ * 0.0;
  auVar112._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar152));
  auVar181._0_4_ = auVar90._0_4_ * auVar103._0_4_;
  auVar181._4_4_ = auVar90._4_4_ * auVar103._4_4_;
  auVar181._8_4_ = auVar90._8_4_ * auVar103._8_4_;
  auVar181._12_4_ = auVar90._12_4_ * auVar103._12_4_;
  auVar181._16_4_ = auVar103._16_4_ * 0.0;
  auVar181._20_4_ = auVar103._20_4_ * 0.0;
  auVar181._24_4_ = auVar103._24_4_ * 0.0;
  auVar181._28_4_ = 0;
  auVar103 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar172));
  auVar106._4_4_ = auVar91._4_4_ * auVar103._4_4_;
  auVar106._0_4_ = auVar91._0_4_ * auVar103._0_4_;
  auVar106._8_4_ = auVar91._8_4_ * auVar103._8_4_;
  auVar106._12_4_ = auVar91._12_4_ * auVar103._12_4_;
  auVar106._16_4_ = auVar103._16_4_ * 0.0;
  auVar106._20_4_ = auVar103._20_4_ * 0.0;
  auVar106._24_4_ = auVar103._24_4_ * 0.0;
  auVar106._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar172));
  auVar173._0_4_ = auVar91._0_4_ * auVar103._0_4_;
  auVar173._4_4_ = auVar91._4_4_ * auVar103._4_4_;
  auVar173._8_4_ = auVar91._8_4_ * auVar103._8_4_;
  auVar173._12_4_ = auVar91._12_4_ * auVar103._12_4_;
  auVar173._16_4_ = auVar103._16_4_ * 0.0;
  auVar173._20_4_ = auVar103._20_4_ * 0.0;
  auVar173._24_4_ = auVar103._24_4_ * 0.0;
  auVar173._28_4_ = 0;
  auVar103 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar92));
  auVar107._4_4_ = auVar94._4_4_ * auVar103._4_4_;
  auVar107._0_4_ = auVar94._0_4_ * auVar103._0_4_;
  auVar107._8_4_ = auVar94._8_4_ * auVar103._8_4_;
  auVar107._12_4_ = auVar94._12_4_ * auVar103._12_4_;
  auVar107._16_4_ = auVar103._16_4_ * 0.0;
  auVar107._20_4_ = auVar103._20_4_ * 0.0;
  auVar107._24_4_ = auVar103._24_4_ * 0.0;
  auVar107._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar92));
  auVar157._0_4_ = auVar94._0_4_ * auVar103._0_4_;
  auVar157._4_4_ = auVar94._4_4_ * auVar103._4_4_;
  auVar157._8_4_ = auVar94._8_4_ * auVar103._8_4_;
  auVar157._12_4_ = auVar94._12_4_ * auVar103._12_4_;
  auVar157._16_4_ = auVar103._16_4_ * 0.0;
  auVar157._20_4_ = auVar103._20_4_ * 0.0;
  auVar157._24_4_ = auVar103._24_4_ * 0.0;
  auVar157._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar112,auVar181);
  auVar102 = vpminsd_avx2(auVar106,auVar173);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar102 = vpminsd_avx2(auVar107,auVar157);
  uVar151 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar114._4_4_ = uVar151;
  auVar114._0_4_ = uVar151;
  auVar114._8_4_ = uVar151;
  auVar114._12_4_ = uVar151;
  auVar114._16_4_ = uVar151;
  auVar114._20_4_ = uVar151;
  auVar114._24_4_ = uVar151;
  auVar114._28_4_ = uVar151;
  auVar102 = vmaxps_avx512vl(auVar102,auVar114);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_540 = vmulps_avx512vl(auVar103,auVar102);
  auVar228 = ZEXT3264(local_540);
  auVar103 = vpmaxsd_avx2(auVar112,auVar181);
  auVar102 = vpmaxsd_avx2(auVar106,auVar173);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar102 = vpmaxsd_avx2(auVar107,auVar157);
  uVar151 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar113._4_4_ = uVar151;
  auVar113._0_4_ = uVar151;
  auVar113._8_4_ = uVar151;
  auVar113._12_4_ = uVar151;
  auVar113._16_4_ = uVar151;
  auVar113._20_4_ = uVar151;
  auVar113._24_4_ = uVar151;
  auVar113._28_4_ = uVar151;
  auVar102 = vminps_avx512vl(auVar102,auVar113);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar104);
  auVar102 = vpbroadcastd_avx512vl();
  uVar27 = vpcmpgtd_avx512vl(auVar102,_DAT_01fe9900);
  uVar171 = vcmpps_avx512vl(local_540,auVar103,2);
  if ((byte)((byte)uVar171 & (byte)uVar27) != 0) {
    uVar85 = (ulong)(byte)((byte)uVar171 & (byte)uVar27);
    local_5e8 = pre->ray_space + k;
    local_628 = (undefined1 (*) [32])&local_140;
    auVar229 = ZEXT464(0xbf800000);
    local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar90 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar230 = ZEXT1664(auVar90);
    do {
      lVar28 = 0;
      for (uVar78 = uVar85; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar84 = *(uint *)(prim + 2);
      uVar13 = *(uint *)(prim + lVar28 * 4 + 6);
      pGVar83 = (context->scene->geometries).items[uVar84].ptr;
      uVar78 = (ulong)*(uint *)(*(long *)&pGVar83->field_0x58 +
                               (ulong)uVar13 *
                               pGVar83[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar176 = (pGVar83->time_range).lower;
      fVar176 = pGVar83->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar176) /
                ((pGVar83->time_range).upper - fVar176));
      auVar90 = vroundss_avx(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),9);
      auVar91 = vaddss_avx512f(ZEXT416((uint)pGVar83->fnumTimeSegments),auVar229._0_16_);
      auVar90 = vminss_avx(auVar90,auVar91);
      auVar90 = vmaxss_avx512f(auVar230._0_16_,auVar90);
      fVar176 = fVar176 - auVar90._0_4_;
      _Var16 = pGVar83[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar82 = (long)(int)auVar90._0_4_ * 0x38;
      lVar28 = *(long *)(_Var16 + 0x10 + lVar82);
      lVar81 = *(long *)(_Var16 + 0x38 + lVar82);
      lVar17 = *(long *)(_Var16 + 0x48 + lVar82);
      auVar172._4_4_ = fVar176;
      auVar172._0_4_ = fVar176;
      auVar172._8_4_ = fVar176;
      auVar172._12_4_ = fVar176;
      pfVar3 = (float *)(lVar81 + uVar78 * lVar17);
      auVar92._0_4_ = fVar176 * *pfVar3;
      auVar92._4_4_ = fVar176 * pfVar3[1];
      auVar92._8_4_ = fVar176 * pfVar3[2];
      auVar92._12_4_ = fVar176 * pfVar3[3];
      pfVar3 = (float *)(lVar81 + (uVar78 + 1) * lVar17);
      auVar93._0_4_ = fVar176 * *pfVar3;
      auVar93._4_4_ = fVar176 * pfVar3[1];
      auVar93._8_4_ = fVar176 * pfVar3[2];
      auVar93._12_4_ = fVar176 * pfVar3[3];
      auVar90 = vmulps_avx512vl(auVar172,*(undefined1 (*) [16])(lVar81 + (uVar78 + 2) * lVar17));
      auVar91 = vmulps_avx512vl(auVar172,*(undefined1 (*) [16])(lVar81 + lVar17 * (uVar78 + 3)));
      lVar81 = *(long *)(_Var16 + lVar82);
      fVar176 = 1.0 - fVar176;
      auVar152._4_4_ = fVar176;
      auVar152._0_4_ = fVar176;
      auVar152._8_4_ = fVar176;
      auVar152._12_4_ = fVar176;
      auVar6 = vfmadd231ps_fma(auVar92,auVar152,*(undefined1 (*) [16])(lVar81 + lVar28 * uVar78));
      auVar7 = vfmadd231ps_fma(auVar93,auVar152,
                               *(undefined1 (*) [16])(lVar81 + lVar28 * (uVar78 + 1)));
      auVar92 = vfmadd231ps_avx512vl
                          (auVar90,auVar152,*(undefined1 (*) [16])(lVar81 + lVar28 * (uVar78 + 2)));
      auVar93 = vfmadd231ps_avx512vl
                          (auVar91,auVar152,*(undefined1 (*) [16])(lVar81 + lVar28 * (uVar78 + 3)));
      iVar14 = (int)pGVar83[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar28 = (long)iVar14 * 0x44;
      auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar94 = vsubps_avx(auVar6,auVar90);
      uVar151 = auVar94._0_4_;
      auVar96._4_4_ = uVar151;
      auVar96._0_4_ = uVar151;
      auVar96._8_4_ = uVar151;
      auVar96._12_4_ = uVar151;
      auVar91 = vshufps_avx(auVar94,auVar94,0x55);
      aVar4 = (local_5e8->vx).field_0;
      aVar5 = (local_5e8->vy).field_0;
      fVar176 = (local_5e8->vz).field_0.m128[0];
      fVar149 = *(float *)((long)&(local_5e8->vz).field_0 + 4);
      fVar150 = *(float *)((long)&(local_5e8->vz).field_0 + 8);
      fVar166 = *(float *)((long)&(local_5e8->vz).field_0 + 0xc);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar217._0_4_ = fVar176 * auVar94._0_4_;
      auVar217._4_4_ = fVar149 * auVar94._4_4_;
      auVar217._8_4_ = fVar150 * auVar94._8_4_;
      auVar217._12_4_ = fVar166 * auVar94._12_4_;
      auVar91 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar91);
      auVar8 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar4,auVar96);
      auVar94 = vsubps_avx(auVar7,auVar90);
      uVar151 = auVar94._0_4_;
      auVar97._4_4_ = uVar151;
      auVar97._0_4_ = uVar151;
      auVar97._8_4_ = uVar151;
      auVar97._12_4_ = uVar151;
      auVar91 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar218._0_4_ = fVar176 * auVar94._0_4_;
      auVar218._4_4_ = fVar149 * auVar94._4_4_;
      auVar218._8_4_ = fVar150 * auVar94._8_4_;
      auVar218._12_4_ = fVar166 * auVar94._12_4_;
      auVar91 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar5,auVar91);
      auVar9 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar4,auVar97);
      auVar94 = vsubps_avx512vl(auVar92,auVar90);
      uVar151 = auVar94._0_4_;
      auVar98._4_4_ = uVar151;
      auVar98._0_4_ = uVar151;
      auVar98._8_4_ = uVar151;
      auVar98._12_4_ = uVar151;
      auVar91 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar219._0_4_ = fVar176 * auVar94._0_4_;
      auVar219._4_4_ = fVar149 * auVar94._4_4_;
      auVar219._8_4_ = fVar150 * auVar94._8_4_;
      auVar219._12_4_ = fVar166 * auVar94._12_4_;
      auVar91 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar5,auVar91);
      auVar94 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar4,auVar98);
      auVar91 = vsubps_avx512vl(auVar93,auVar90);
      uVar151 = auVar91._0_4_;
      auVar95._4_4_ = uVar151;
      auVar95._0_4_ = uVar151;
      auVar95._8_4_ = uVar151;
      auVar95._12_4_ = uVar151;
      auVar90 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar221._0_4_ = fVar176 * auVar91._0_4_;
      auVar221._4_4_ = fVar149 * auVar91._4_4_;
      auVar221._8_4_ = fVar150 * auVar91._8_4_;
      auVar221._12_4_ = fVar166 * auVar91._12_4_;
      auVar90 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar90);
      auVar10 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar95);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar28);
      uVar151 = auVar8._0_4_;
      local_400._4_4_ = uVar151;
      local_400._0_4_ = uVar151;
      local_400._8_4_ = uVar151;
      local_400._12_4_ = uVar151;
      local_400._16_4_ = uVar151;
      local_400._20_4_ = uVar151;
      local_400._24_4_ = uVar151;
      local_400._28_4_ = uVar151;
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x484);
      auVar158._8_4_ = 1;
      auVar158._0_8_ = 0x100000001;
      auVar158._12_4_ = 1;
      auVar158._16_4_ = 1;
      auVar158._20_4_ = 1;
      auVar158._24_4_ = 1;
      auVar158._28_4_ = 1;
      local_420 = vpermps_avx2(auVar158,ZEXT1632(auVar8));
      uVar151 = auVar9._0_4_;
      auVar184._4_4_ = uVar151;
      auVar184._0_4_ = uVar151;
      auVar184._8_4_ = uVar151;
      auVar184._12_4_ = uVar151;
      local_440._16_4_ = uVar151;
      local_440._0_16_ = auVar184;
      local_440._20_4_ = uVar151;
      local_440._24_4_ = uVar151;
      local_440._28_4_ = uVar151;
      local_460 = vpermps_avx512vl(auVar158,ZEXT1632(auVar9));
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x908);
      local_480 = vbroadcastss_avx512vl(auVar94);
      local_4a0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar94));
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0xd8c);
      uVar151 = auVar10._0_4_;
      local_4c0._4_4_ = uVar151;
      local_4c0._0_4_ = uVar151;
      fStack_4b8 = (float)uVar151;
      fStack_4b4 = (float)uVar151;
      fStack_4b0 = (float)uVar151;
      fStack_4ac = (float)uVar151;
      fStack_4a8 = (float)uVar151;
      register0x0000139c = uVar151;
      _local_4e0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar10));
      auVar104 = vmulps_avx512vl(_local_4c0,auVar113);
      auVar105 = vmulps_avx512vl(_local_4e0,auVar113);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_480);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_4a0);
      auVar90 = vfmadd231ps_fma(auVar104,auVar102,local_440);
      auVar106 = vfmadd231ps_avx512vl(auVar105,auVar102,local_460);
      auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar103,local_400);
      auVar206 = ZEXT3264(auVar107);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar28);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x484);
      auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x908);
      auVar108 = vfmadd231ps_avx512vl(auVar106,auVar103,local_420);
      auVar196 = ZEXT3264(auVar108);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0xd8c);
      auVar101 = vmulps_avx512vl(_local_4c0,auVar106);
      auVar109 = vmulps_avx512vl(_local_4e0,auVar106);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar112,local_480);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,local_4a0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_440);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_460);
      auVar11 = vfmadd231ps_fma(auVar101,auVar104,local_400);
      auVar210 = ZEXT1664(auVar11);
      auVar152 = vfmadd231ps_fma(auVar109,auVar104,local_420);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar11),auVar107);
      auVar109 = vsubps_avx512vl(ZEXT1632(auVar152),auVar108);
      auVar110 = vmulps_avx512vl(auVar108,auVar101);
      auVar99 = vmulps_avx512vl(auVar107,auVar109);
      auVar110 = vsubps_avx512vl(auVar110,auVar99);
      auVar90 = vshufps_avx(auVar6,auVar6,0xff);
      uVar171 = auVar90._0_8_;
      local_80._8_8_ = uVar171;
      local_80._0_8_ = uVar171;
      local_80._16_8_ = uVar171;
      local_80._24_8_ = uVar171;
      auVar90 = vshufps_avx(auVar7,auVar7,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(auVar92,auVar92,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(auVar93,auVar93,0xff);
      uVar171 = auVar90._0_8_;
      local_e0._8_8_ = uVar171;
      local_e0._0_8_ = uVar171;
      local_e0._16_8_ = uVar171;
      local_e0._24_8_ = uVar171;
      auVar99 = vmulps_avx512vl(local_e0,auVar113);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar114,local_c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_80);
      auVar100 = vmulps_avx512vl(local_e0,auVar106);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar112,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_a0);
      auVar172 = vfmadd231ps_fma(auVar100,auVar104,local_80);
      auVar100 = vmulps_avx512vl(auVar109,auVar109);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar101);
      auVar111 = vmaxps_avx512vl(auVar99,ZEXT1632(auVar172));
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      auVar100 = vmulps_avx512vl(auVar111,auVar100);
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      uVar171 = vcmpps_avx512vl(auVar110,auVar100,2);
      auVar90 = vblendps_avx(auVar8,auVar6,8);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar91 = vandps_avx512vl(auVar90,auVar95);
      auVar90 = vblendps_avx(auVar9,auVar7,8);
      auVar90 = vandps_avx512vl(auVar90,auVar95);
      auVar91 = vmaxps_avx(auVar91,auVar90);
      auVar90 = vblendps_avx(auVar94,auVar92,8);
      auVar96 = vandps_avx512vl(auVar90,auVar95);
      auVar90 = vblendps_avx(auVar10,auVar93,8);
      auVar90 = vandps_avx512vl(auVar90,auVar95);
      auVar90 = vmaxps_avx(auVar96,auVar90);
      auVar90 = vmaxps_avx(auVar91,auVar90);
      auVar91 = vmovshdup_avx(auVar90);
      auVar91 = vmaxss_avx(auVar91,auVar90);
      auVar90 = vshufpd_avx(auVar90,auVar90,1);
      auVar90 = vmaxss_avx(auVar90,auVar91);
      auVar91 = vcvtsi2ss_avx512f(auVar92,iVar14);
      local_580._0_16_ = auVar91;
      auVar213._0_4_ = auVar91._0_4_;
      auVar213._4_4_ = auVar213._0_4_;
      auVar213._8_4_ = auVar213._0_4_;
      auVar213._12_4_ = auVar213._0_4_;
      auVar213._16_4_ = auVar213._0_4_;
      auVar213._20_4_ = auVar213._0_4_;
      auVar213._24_4_ = auVar213._0_4_;
      auVar213._28_4_ = auVar213._0_4_;
      uVar27 = vcmpps_avx512vl(auVar213,_DAT_01faff40,0xe);
      bVar86 = (byte)uVar171 & (byte)uVar27;
      fVar176 = auVar90._0_4_ * 4.7683716e-07;
      local_5c0._0_16_ = ZEXT416((uint)fVar176);
      auVar214._8_4_ = 2;
      auVar214._0_8_ = 0x200000002;
      auVar214._12_4_ = 2;
      auVar214._16_4_ = 2;
      auVar214._20_4_ = 2;
      auVar214._24_4_ = 2;
      auVar214._28_4_ = 2;
      local_240 = vpermps_avx2(auVar214,ZEXT1632(auVar8));
      local_260 = vpermps_avx2(auVar214,ZEXT1632(auVar9));
      local_280 = vpermps_avx2(auVar214,ZEXT1632(auVar94));
      local_2a0 = vpermps_avx2(auVar214,ZEXT1632(auVar10));
      local_560 = *(undefined4 *)(ray + k * 4 + 0x60);
      uStack_55c = 0;
      uStack_558 = 0;
      uStack_554 = 0;
      local_670 = auVar6._0_8_;
      uStack_668 = auVar6._8_8_;
      local_680 = auVar7._0_8_;
      uStack_678 = auVar7._8_8_;
      local_690 = auVar92._0_8_;
      uStack_688 = auVar92._8_8_;
      local_6a0._0_4_ = auVar93._0_4_;
      fVar149 = (float)local_6a0;
      local_6a0._4_4_ = auVar93._4_4_;
      fVar150 = local_6a0._4_4_;
      uStack_698._0_4_ = auVar93._8_4_;
      fVar166 = (float)uStack_698;
      uStack_698._4_4_ = auVar93._12_4_;
      fVar167 = uStack_698._4_4_;
      local_6a0 = auVar93._0_8_;
      uStack_698 = auVar93._8_8_;
      if (bVar86 != 0) {
        auVar106 = vmulps_avx512vl(local_2a0,auVar106);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_280,auVar106);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_260,auVar112);
        auVar105 = vfmadd213ps_avx512vl(auVar104,local_240,auVar105);
        auVar113 = vmulps_avx512vl(local_2a0,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_280,auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar102,local_260,auVar114);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1f9c);
        auVar112 = vfmadd213ps_avx512vl(auVar103,local_240,auVar112);
        auVar103 = vmulps_avx512vl(_local_4c0,auVar104);
        auVar106 = vmulps_avx512vl(_local_4e0,auVar104);
        auVar104 = vmulps_avx512vl(local_2a0,auVar104);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,local_480);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,local_4a0);
        auVar113 = vfmadd231ps_avx512vl(auVar104,local_280,auVar113);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar114,local_440);
        auVar104 = vfmadd231ps_avx512vl(auVar106,auVar114,local_460);
        auVar106 = vfmadd231ps_avx512vl(auVar113,local_260,auVar114);
        auVar90 = vfmadd231ps_fma(auVar103,auVar102,local_400);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_420);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1f9c);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_240,auVar102);
        auVar102 = vmulps_avx512vl(_local_4c0,auVar113);
        auVar110 = vmulps_avx512vl(_local_4e0,auVar113);
        auVar113 = vmulps_avx512vl(local_2a0,auVar113);
        auVar100 = vfmadd231ps_avx512vl(auVar102,auVar114,local_480);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,local_4a0);
        auVar114 = vfmadd231ps_avx512vl(auVar113,local_280,auVar114);
        auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1694);
        auVar113 = vfmadd231ps_avx512vl(auVar100,auVar102,local_440);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar102,local_460);
        auVar102 = vfmadd231ps_avx512vl(auVar114,local_260,auVar102);
        auVar229 = ZEXT1664(auVar229._0_16_);
        auVar228 = ZEXT3264(auVar228._0_32_);
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar91 = vfmadd231ps_fma(auVar113,auVar103,local_400);
        auVar114 = vfmadd231ps_avx512vl(auVar110,auVar103,local_420);
        auVar113 = vfmadd231ps_avx512vl(auVar102,local_240,auVar103);
        auVar94 = vxorps_avx512vl(local_240._0_16_,local_240._0_16_);
        auVar230 = ZEXT1664(auVar94);
        auVar223._8_4_ = 0x7fffffff;
        auVar223._0_8_ = 0x7fffffff7fffffff;
        auVar223._12_4_ = 0x7fffffff;
        auVar223._16_4_ = 0x7fffffff;
        auVar223._20_4_ = 0x7fffffff;
        auVar223._24_4_ = 0x7fffffff;
        auVar223._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(ZEXT1632(auVar90),auVar223);
        auVar102 = vandps_avx(auVar104,auVar223);
        auVar102 = vmaxps_avx(auVar103,auVar102);
        auVar103 = vandps_avx(auVar106,auVar223);
        auVar103 = vmaxps_avx(auVar102,auVar103);
        auVar215._4_4_ = fVar176;
        auVar215._0_4_ = fVar176;
        auVar215._8_4_ = fVar176;
        auVar215._12_4_ = fVar176;
        auVar215._16_4_ = fVar176;
        auVar215._20_4_ = fVar176;
        auVar215._24_4_ = fVar176;
        auVar215._28_4_ = fVar176;
        uVar78 = vcmpps_avx512vl(auVar103,auVar215,1);
        bVar19 = (bool)((byte)uVar78 & 1);
        auVar115._0_4_ = (float)((uint)bVar19 * auVar101._0_4_ | (uint)!bVar19 * auVar90._0_4_);
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar19 * auVar101._4_4_ | (uint)!bVar19 * auVar90._4_4_);
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar19 * auVar101._8_4_ | (uint)!bVar19 * auVar90._8_4_);
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar19 * auVar101._12_4_ | (uint)!bVar19 * auVar90._12_4_);
        fVar169 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar101._16_4_);
        auVar115._16_4_ = fVar169;
        fVar168 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar101._20_4_);
        auVar115._20_4_ = fVar168;
        fVar176 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar101._24_4_);
        auVar115._24_4_ = fVar176;
        auVar115._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar101._28_4_;
        bVar19 = (bool)((byte)uVar78 & 1);
        auVar116._0_4_ = (float)((uint)bVar19 * auVar109._0_4_ | (uint)!bVar19 * auVar104._0_4_);
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar19 * auVar109._4_4_ | (uint)!bVar19 * auVar104._4_4_);
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar19 * auVar109._8_4_ | (uint)!bVar19 * auVar104._8_4_);
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar19 * auVar109._12_4_ | (uint)!bVar19 * auVar104._12_4_);
        bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar19 * auVar109._16_4_ | (uint)!bVar19 * auVar104._16_4_);
        bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar19 * auVar109._20_4_ | (uint)!bVar19 * auVar104._20_4_);
        bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * auVar104._24_4_);
        bVar19 = SUB81(uVar78 >> 7,0);
        auVar116._28_4_ = (uint)bVar19 * auVar109._28_4_ | (uint)!bVar19 * auVar104._28_4_;
        auVar103 = vandps_avx(auVar223,ZEXT1632(auVar91));
        auVar102 = vandps_avx(auVar114,auVar223);
        auVar102 = vmaxps_avx(auVar103,auVar102);
        auVar103 = vandps_avx(auVar113,auVar223);
        auVar103 = vmaxps_avx(auVar102,auVar103);
        uVar78 = vcmpps_avx512vl(auVar103,auVar215,1);
        bVar19 = (bool)((byte)uVar78 & 1);
        auVar117._0_4_ = (float)((uint)bVar19 * auVar101._0_4_ | (uint)!bVar19 * auVar91._0_4_);
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar19 * auVar101._4_4_ | (uint)!bVar19 * auVar91._4_4_);
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar19 * auVar101._8_4_ | (uint)!bVar19 * auVar91._8_4_);
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar19 * auVar101._12_4_ | (uint)!bVar19 * auVar91._12_4_);
        fVar183 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar101._16_4_);
        auVar117._16_4_ = fVar183;
        fVar175 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar101._20_4_);
        auVar117._20_4_ = fVar175;
        fVar170 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar101._24_4_);
        auVar117._24_4_ = fVar170;
        uVar79 = (uint)(byte)(uVar78 >> 7) * auVar101._28_4_;
        auVar117._28_4_ = uVar79;
        bVar19 = (bool)((byte)uVar78 & 1);
        auVar118._0_4_ = (float)((uint)bVar19 * auVar109._0_4_ | (uint)!bVar19 * auVar114._0_4_);
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar19 * auVar109._4_4_ | (uint)!bVar19 * auVar114._4_4_);
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar19 * auVar109._8_4_ | (uint)!bVar19 * auVar114._8_4_);
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar19 * auVar109._12_4_ | (uint)!bVar19 * auVar114._12_4_);
        bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar19 * auVar109._16_4_ | (uint)!bVar19 * auVar114._16_4_);
        bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar19 * auVar109._20_4_ | (uint)!bVar19 * auVar114._20_4_);
        bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * auVar114._24_4_);
        bVar19 = SUB81(uVar78 >> 7,0);
        auVar118._28_4_ = (uint)bVar19 * auVar109._28_4_ | (uint)!bVar19 * auVar114._28_4_;
        auVar97 = vxorps_avx512vl(auVar184,auVar184);
        auVar103 = vfmadd213ps_avx512vl(auVar115,auVar115,ZEXT1632(auVar97));
        auVar90 = vfmadd231ps_fma(auVar103,auVar116,auVar116);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar88 = auVar103._0_4_;
        fVar89 = auVar103._4_4_;
        fVar140 = auVar103._8_4_;
        fVar141 = auVar103._12_4_;
        fVar142 = auVar103._16_4_;
        fVar143 = auVar103._20_4_;
        fVar145 = auVar103._24_4_;
        auVar34._4_4_ = fVar89 * fVar89 * fVar89 * auVar90._4_4_ * -0.5;
        auVar34._0_4_ = fVar88 * fVar88 * fVar88 * auVar90._0_4_ * -0.5;
        auVar34._8_4_ = fVar140 * fVar140 * fVar140 * auVar90._8_4_ * -0.5;
        auVar34._12_4_ = fVar141 * fVar141 * fVar141 * auVar90._12_4_ * -0.5;
        auVar34._16_4_ = fVar142 * fVar142 * fVar142 * -0.0;
        auVar34._20_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar34._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
        auVar34._28_4_ = auVar113._28_4_;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar103 = vfmadd231ps_avx512vl(auVar34,auVar102,auVar103);
        auVar35._4_4_ = auVar116._4_4_ * auVar103._4_4_;
        auVar35._0_4_ = auVar116._0_4_ * auVar103._0_4_;
        auVar35._8_4_ = auVar116._8_4_ * auVar103._8_4_;
        auVar35._12_4_ = auVar116._12_4_ * auVar103._12_4_;
        auVar35._16_4_ = auVar116._16_4_ * auVar103._16_4_;
        auVar35._20_4_ = auVar116._20_4_ * auVar103._20_4_;
        auVar35._24_4_ = auVar116._24_4_ * auVar103._24_4_;
        auVar35._28_4_ = 0;
        auVar36._4_4_ = auVar103._4_4_ * -auVar115._4_4_;
        auVar36._0_4_ = auVar103._0_4_ * -auVar115._0_4_;
        auVar36._8_4_ = auVar103._8_4_ * -auVar115._8_4_;
        auVar36._12_4_ = auVar103._12_4_ * -auVar115._12_4_;
        auVar36._16_4_ = auVar103._16_4_ * -fVar169;
        auVar36._20_4_ = auVar103._20_4_ * -fVar168;
        auVar36._24_4_ = auVar103._24_4_ * -fVar176;
        auVar36._28_4_ = auVar116._28_4_;
        auVar103 = vmulps_avx512vl(auVar103,ZEXT1632(auVar97));
        auVar101 = ZEXT1632(auVar97);
        auVar114 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar101);
        auVar90 = vfmadd231ps_fma(auVar114,auVar118,auVar118);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar176 = auVar114._0_4_;
        fVar168 = auVar114._4_4_;
        fVar169 = auVar114._8_4_;
        fVar88 = auVar114._12_4_;
        fVar89 = auVar114._16_4_;
        fVar140 = auVar114._20_4_;
        fVar141 = auVar114._24_4_;
        auVar37._4_4_ = fVar168 * fVar168 * fVar168 * auVar90._4_4_ * -0.5;
        auVar37._0_4_ = fVar176 * fVar176 * fVar176 * auVar90._0_4_ * -0.5;
        auVar37._8_4_ = fVar169 * fVar169 * fVar169 * auVar90._8_4_ * -0.5;
        auVar37._12_4_ = fVar88 * fVar88 * fVar88 * auVar90._12_4_ * -0.5;
        auVar37._16_4_ = fVar89 * fVar89 * fVar89 * -0.0;
        auVar37._20_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar37._24_4_ = fVar141 * fVar141 * fVar141 * -0.0;
        auVar37._28_4_ = 0;
        auVar102 = vfmadd231ps_avx512vl(auVar37,auVar102,auVar114);
        auVar38._4_4_ = auVar118._4_4_ * auVar102._4_4_;
        auVar38._0_4_ = auVar118._0_4_ * auVar102._0_4_;
        auVar38._8_4_ = auVar118._8_4_ * auVar102._8_4_;
        auVar38._12_4_ = auVar118._12_4_ * auVar102._12_4_;
        auVar38._16_4_ = auVar118._16_4_ * auVar102._16_4_;
        auVar38._20_4_ = auVar118._20_4_ * auVar102._20_4_;
        auVar38._24_4_ = auVar118._24_4_ * auVar102._24_4_;
        auVar38._28_4_ = auVar114._28_4_;
        auVar39._4_4_ = -auVar117._4_4_ * auVar102._4_4_;
        auVar39._0_4_ = -auVar117._0_4_ * auVar102._0_4_;
        auVar39._8_4_ = -auVar117._8_4_ * auVar102._8_4_;
        auVar39._12_4_ = -auVar117._12_4_ * auVar102._12_4_;
        auVar39._16_4_ = -fVar183 * auVar102._16_4_;
        auVar39._20_4_ = -fVar175 * auVar102._20_4_;
        auVar39._24_4_ = -fVar170 * auVar102._24_4_;
        auVar39._28_4_ = uVar79 ^ 0x80000000;
        auVar102 = vmulps_avx512vl(auVar102,auVar101);
        auVar90 = vfmadd213ps_fma(auVar35,auVar99,auVar107);
        auVar91 = vfmadd213ps_fma(auVar36,auVar99,auVar108);
        auVar114 = vfmadd213ps_avx512vl(auVar103,auVar99,auVar112);
        auVar113 = vfmadd213ps_avx512vl(auVar38,ZEXT1632(auVar172),ZEXT1632(auVar11));
        auVar93 = vfnmadd213ps_fma(auVar35,auVar99,auVar107);
        auVar106 = ZEXT1632(auVar172);
        auVar94 = vfmadd213ps_fma(auVar39,auVar106,ZEXT1632(auVar152));
        auVar95 = vfnmadd213ps_fma(auVar36,auVar99,auVar108);
        auVar8 = vfmadd213ps_fma(auVar102,auVar106,auVar105);
        auVar104 = vfnmadd231ps_avx512vl(auVar112,auVar99,auVar103);
        auVar11 = vfnmadd213ps_fma(auVar38,auVar106,ZEXT1632(auVar11));
        auVar152 = vfnmadd213ps_fma(auVar39,auVar106,ZEXT1632(auVar152));
        auVar96 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar172),auVar102);
        auVar102 = vsubps_avx512vl(auVar113,ZEXT1632(auVar93));
        auVar103 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar95));
        auVar105 = vsubps_avx512vl(ZEXT1632(auVar8),auVar104);
        auVar112 = vmulps_avx512vl(auVar103,auVar104);
        auVar9 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar95),auVar105);
        auVar40._4_4_ = auVar93._4_4_ * auVar105._4_4_;
        auVar40._0_4_ = auVar93._0_4_ * auVar105._0_4_;
        auVar40._8_4_ = auVar93._8_4_ * auVar105._8_4_;
        auVar40._12_4_ = auVar93._12_4_ * auVar105._12_4_;
        auVar40._16_4_ = auVar105._16_4_ * 0.0;
        auVar40._20_4_ = auVar105._20_4_ * 0.0;
        auVar40._24_4_ = auVar105._24_4_ * 0.0;
        auVar40._28_4_ = auVar105._28_4_;
        auVar105 = vfmsub231ps_avx512vl(auVar40,auVar104,auVar102);
        auVar41._4_4_ = auVar95._4_4_ * auVar102._4_4_;
        auVar41._0_4_ = auVar95._0_4_ * auVar102._0_4_;
        auVar41._8_4_ = auVar95._8_4_ * auVar102._8_4_;
        auVar41._12_4_ = auVar95._12_4_ * auVar102._12_4_;
        auVar41._16_4_ = auVar102._16_4_ * 0.0;
        auVar41._20_4_ = auVar102._20_4_ * 0.0;
        auVar41._24_4_ = auVar102._24_4_ * 0.0;
        auVar41._28_4_ = auVar102._28_4_;
        auVar10 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar93),auVar103);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar101,auVar105);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,ZEXT1632(auVar9));
        auVar109 = ZEXT1632(auVar97);
        uVar78 = vcmpps_avx512vl(auVar103,auVar109,2);
        bVar77 = (byte)uVar78;
        fVar88 = (float)((uint)(bVar77 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar77 & 1) * auVar11._0_4_);
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        fVar140 = (float)((uint)bVar19 * auVar90._4_4_ | (uint)!bVar19 * auVar11._4_4_);
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        fVar142 = (float)((uint)bVar19 * auVar90._8_4_ | (uint)!bVar19 * auVar11._8_4_);
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        fVar145 = (float)((uint)bVar19 * auVar90._12_4_ | (uint)!bVar19 * auVar11._12_4_);
        auVar112 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar142,CONCAT44(fVar140,fVar88))));
        fVar89 = (float)((uint)(bVar77 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar77 & 1) * auVar152._0_4_);
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        fVar141 = (float)((uint)bVar19 * auVar91._4_4_ | (uint)!bVar19 * auVar152._4_4_);
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        fVar143 = (float)((uint)bVar19 * auVar91._8_4_ | (uint)!bVar19 * auVar152._8_4_);
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        fVar146 = (float)((uint)bVar19 * auVar91._12_4_ | (uint)!bVar19 * auVar152._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar143,CONCAT44(fVar141,fVar89))));
        auVar119._0_4_ =
             (float)((uint)(bVar77 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar96._0_4_
                    );
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar19 * auVar114._4_4_ | (uint)!bVar19 * auVar96._4_4_);
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar19 * auVar114._8_4_ | (uint)!bVar19 * auVar96._8_4_);
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar19 * auVar114._12_4_ | (uint)!bVar19 * auVar96._12_4_);
        fVar169 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar114._16_4_);
        auVar119._16_4_ = fVar169;
        fVar176 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar114._20_4_);
        auVar119._20_4_ = fVar176;
        fVar168 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar114._24_4_);
        auVar119._24_4_ = fVar168;
        iVar1 = (uint)(byte)(uVar78 >> 7) * auVar114._28_4_;
        auVar119._28_4_ = iVar1;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar93),auVar113);
        auVar120._0_4_ =
             (uint)(bVar77 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar9._0_4_;
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar19 * auVar102._4_4_ | (uint)!bVar19 * auVar9._4_4_;
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar19 * auVar102._8_4_ | (uint)!bVar19 * auVar9._8_4_;
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar19 * auVar102._12_4_ | (uint)!bVar19 * auVar9._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar102._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar102._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar102._24_4_;
        auVar120._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar94));
        auVar121._0_4_ =
             (float)((uint)(bVar77 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar91._0_4_
                    );
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar19 * auVar102._4_4_ | (uint)!bVar19 * auVar91._4_4_);
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar19 * auVar102._8_4_ | (uint)!bVar19 * auVar91._8_4_);
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar19 * auVar102._12_4_ | (uint)!bVar19 * auVar91._12_4_);
        fVar183 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar102._16_4_);
        auVar121._16_4_ = fVar183;
        fVar175 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar102._20_4_);
        auVar121._20_4_ = fVar175;
        fVar170 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar102._24_4_);
        auVar121._24_4_ = fVar170;
        auVar121._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar8));
        auVar122._0_4_ =
             (float)((uint)(bVar77 & 1) * auVar102._0_4_ |
                    (uint)!(bool)(bVar77 & 1) * auVar114._0_4_);
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar19 * auVar102._4_4_ | (uint)!bVar19 * auVar114._4_4_);
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar19 * auVar102._8_4_ | (uint)!bVar19 * auVar114._8_4_);
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar19 * auVar102._12_4_ | (uint)!bVar19 * auVar114._12_4_);
        bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar19 * auVar102._16_4_ | (uint)!bVar19 * auVar114._16_4_);
        bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar19 * auVar102._20_4_ | (uint)!bVar19 * auVar114._20_4_);
        bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar19 * auVar102._24_4_ | (uint)!bVar19 * auVar114._24_4_);
        bVar19 = SUB81(uVar78 >> 7,0);
        auVar122._28_4_ = (uint)bVar19 * auVar102._28_4_ | (uint)!bVar19 * auVar114._28_4_;
        auVar123._0_4_ =
             (uint)(bVar77 & 1) * (int)auVar93._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar113._0_4_;
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar19 * (int)auVar93._4_4_ | (uint)!bVar19 * auVar113._4_4_;
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar19 * (int)auVar93._8_4_ | (uint)!bVar19 * auVar113._8_4_;
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar19 * (int)auVar93._12_4_ | (uint)!bVar19 * auVar113._12_4_;
        auVar123._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar113._16_4_;
        auVar123._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar113._20_4_;
        auVar123._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar113._24_4_;
        auVar123._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar113._28_4_;
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        bVar21 = (bool)((byte)(uVar78 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar124._0_4_ =
             (uint)(bVar77 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar8._0_4_;
        bVar20 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar20 * auVar104._4_4_ | (uint)!bVar20 * auVar8._4_4_;
        bVar20 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar20 * auVar104._8_4_ | (uint)!bVar20 * auVar8._8_4_;
        bVar20 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar20 * auVar104._12_4_ | (uint)!bVar20 * auVar8._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar104._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar104._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar78 >> 7) * auVar104._28_4_;
        auVar124._28_4_ = iVar2;
        auVar107 = vsubps_avx512vl(auVar123,auVar112);
        auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar95._12_4_ |
                                                 (uint)!bVar22 * auVar94._12_4_,
                                                 CONCAT48((uint)bVar21 * (int)auVar95._8_4_ |
                                                          (uint)!bVar21 * auVar94._8_4_,
                                                          CONCAT44((uint)bVar19 * (int)auVar95._4_4_
                                                                   | (uint)!bVar19 * auVar94._4_4_,
                                                                   (uint)(bVar77 & 1) *
                                                                   (int)auVar95._0_4_ |
                                                                   (uint)!(bool)(bVar77 & 1) *
                                                                   auVar94._0_4_)))),auVar106);
        auVar206 = ZEXT3264(auVar102);
        auVar114 = vsubps_avx(auVar124,auVar119);
        auVar113 = vsubps_avx(auVar112,auVar120);
        auVar210 = ZEXT3264(auVar113);
        auVar104 = vsubps_avx(auVar106,auVar121);
        auVar105 = vsubps_avx(auVar119,auVar122);
        auVar42._4_4_ = auVar114._4_4_ * fVar140;
        auVar42._0_4_ = auVar114._0_4_ * fVar88;
        auVar42._8_4_ = auVar114._8_4_ * fVar142;
        auVar42._12_4_ = auVar114._12_4_ * fVar145;
        auVar42._16_4_ = auVar114._16_4_ * 0.0;
        auVar42._20_4_ = auVar114._20_4_ * 0.0;
        auVar42._24_4_ = auVar114._24_4_ * 0.0;
        auVar42._28_4_ = iVar2;
        auVar90 = vfmsub231ps_fma(auVar42,auVar119,auVar107);
        auVar43._4_4_ = fVar141 * auVar107._4_4_;
        auVar43._0_4_ = fVar89 * auVar107._0_4_;
        auVar43._8_4_ = fVar143 * auVar107._8_4_;
        auVar43._12_4_ = fVar146 * auVar107._12_4_;
        auVar43._16_4_ = auVar107._16_4_ * 0.0;
        auVar43._20_4_ = auVar107._20_4_ * 0.0;
        auVar43._24_4_ = auVar107._24_4_ * 0.0;
        auVar43._28_4_ = auVar103._28_4_;
        auVar91 = vfmsub231ps_fma(auVar43,auVar112,auVar102);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar109,ZEXT1632(auVar90));
        auVar190._0_4_ = auVar102._0_4_ * auVar119._0_4_;
        auVar190._4_4_ = auVar102._4_4_ * auVar119._4_4_;
        auVar190._8_4_ = auVar102._8_4_ * auVar119._8_4_;
        auVar190._12_4_ = auVar102._12_4_ * auVar119._12_4_;
        auVar190._16_4_ = auVar102._16_4_ * fVar169;
        auVar190._20_4_ = auVar102._20_4_ * fVar176;
        auVar190._24_4_ = auVar102._24_4_ * fVar168;
        auVar190._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar190,auVar106,auVar114);
        auVar108 = vfmadd231ps_avx512vl(auVar103,auVar109,ZEXT1632(auVar90));
        auVar103 = vmulps_avx512vl(auVar105,auVar120);
        auVar103 = vfmsub231ps_avx512vl(auVar103,auVar113,auVar122);
        auVar44._4_4_ = auVar104._4_4_ * auVar122._4_4_;
        auVar44._0_4_ = auVar104._0_4_ * auVar122._0_4_;
        auVar44._8_4_ = auVar104._8_4_ * auVar122._8_4_;
        auVar44._12_4_ = auVar104._12_4_ * auVar122._12_4_;
        auVar44._16_4_ = auVar104._16_4_ * auVar122._16_4_;
        auVar44._20_4_ = auVar104._20_4_ * auVar122._20_4_;
        auVar44._24_4_ = auVar104._24_4_ * auVar122._24_4_;
        auVar44._28_4_ = auVar122._28_4_;
        auVar90 = vfmsub231ps_fma(auVar44,auVar121,auVar105);
        auVar191._0_4_ = auVar121._0_4_ * auVar113._0_4_;
        auVar191._4_4_ = auVar121._4_4_ * auVar113._4_4_;
        auVar191._8_4_ = auVar121._8_4_ * auVar113._8_4_;
        auVar191._12_4_ = auVar121._12_4_ * auVar113._12_4_;
        auVar191._16_4_ = fVar183 * auVar113._16_4_;
        auVar191._20_4_ = fVar175 * auVar113._20_4_;
        auVar191._24_4_ = fVar170 * auVar113._24_4_;
        auVar191._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar191,auVar104,auVar120);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar109,auVar103);
        auVar101 = vfmadd231ps_avx512vl(auVar103,auVar109,ZEXT1632(auVar90));
        auVar196 = ZEXT3264(auVar101);
        auVar103 = vmaxps_avx(auVar108,auVar101);
        uVar171 = vcmpps_avx512vl(auVar103,auVar109,2);
        bVar86 = bVar86 & (byte)uVar171;
        if (bVar86 != 0) {
          uVar151 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar224._4_4_ = uVar151;
          auVar224._0_4_ = uVar151;
          auVar224._8_4_ = uVar151;
          auVar224._12_4_ = uVar151;
          auVar224._16_4_ = uVar151;
          auVar224._20_4_ = uVar151;
          auVar224._24_4_ = uVar151;
          auVar224._28_4_ = uVar151;
          auVar227 = ZEXT3264(auVar224);
          auVar45._4_4_ = auVar105._4_4_ * auVar102._4_4_;
          auVar45._0_4_ = auVar105._0_4_ * auVar102._0_4_;
          auVar45._8_4_ = auVar105._8_4_ * auVar102._8_4_;
          auVar45._12_4_ = auVar105._12_4_ * auVar102._12_4_;
          auVar45._16_4_ = auVar105._16_4_ * auVar102._16_4_;
          auVar45._20_4_ = auVar105._20_4_ * auVar102._20_4_;
          auVar45._24_4_ = auVar105._24_4_ * auVar102._24_4_;
          auVar45._28_4_ = auVar103._28_4_;
          auVar8 = vfmsub231ps_fma(auVar45,auVar104,auVar114);
          auVar46._4_4_ = auVar114._4_4_ * auVar113._4_4_;
          auVar46._0_4_ = auVar114._0_4_ * auVar113._0_4_;
          auVar46._8_4_ = auVar114._8_4_ * auVar113._8_4_;
          auVar46._12_4_ = auVar114._12_4_ * auVar113._12_4_;
          auVar46._16_4_ = auVar114._16_4_ * auVar113._16_4_;
          auVar46._20_4_ = auVar114._20_4_ * auVar113._20_4_;
          auVar46._24_4_ = auVar114._24_4_ * auVar113._24_4_;
          auVar46._28_4_ = auVar114._28_4_;
          auVar94 = vfmsub231ps_fma(auVar46,auVar107,auVar105);
          auVar47._4_4_ = auVar104._4_4_ * auVar107._4_4_;
          auVar47._0_4_ = auVar104._0_4_ * auVar107._0_4_;
          auVar47._8_4_ = auVar104._8_4_ * auVar107._8_4_;
          auVar47._12_4_ = auVar104._12_4_ * auVar107._12_4_;
          auVar47._16_4_ = auVar104._16_4_ * auVar107._16_4_;
          auVar47._20_4_ = auVar104._20_4_ * auVar107._20_4_;
          auVar47._24_4_ = auVar104._24_4_ * auVar107._24_4_;
          auVar47._28_4_ = auVar104._28_4_;
          auVar9 = vfmsub231ps_fma(auVar47,auVar113,auVar102);
          auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar9));
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT1632(auVar8),ZEXT1232(ZEXT412(0)) << 0x20)
          ;
          auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar91));
          auVar102 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar91),auVar100);
          auVar90 = vfmadd132ps_fma(auVar102,auVar103,auVar103);
          auVar206 = ZEXT1664(auVar90);
          auVar48._4_4_ = auVar9._4_4_ * auVar119._4_4_;
          auVar48._0_4_ = auVar9._0_4_ * auVar119._0_4_;
          auVar48._8_4_ = auVar9._8_4_ * auVar119._8_4_;
          auVar48._12_4_ = auVar9._12_4_ * auVar119._12_4_;
          auVar48._16_4_ = fVar169 * 0.0;
          auVar48._20_4_ = fVar176 * 0.0;
          auVar48._24_4_ = fVar168 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar94 = vfmadd231ps_fma(auVar48,auVar106,ZEXT1632(auVar94));
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar112,ZEXT1632(auVar8));
          fVar176 = auVar90._0_4_;
          fVar168 = auVar90._4_4_;
          fVar169 = auVar90._8_4_;
          fVar170 = auVar90._12_4_;
          local_5e0._28_4_ = auVar103._28_4_;
          local_5e0._0_28_ =
               ZEXT1628(CONCAT412(auVar94._12_4_ * fVar170,
                                  CONCAT48(auVar94._8_4_ * fVar169,
                                           CONCAT44(auVar94._4_4_ * fVar168,auVar94._0_4_ * fVar176)
                                          )));
          auVar210 = ZEXT3264(local_5e0);
          auVar159._4_4_ = local_560;
          auVar159._0_4_ = local_560;
          auVar159._8_4_ = local_560;
          auVar159._12_4_ = local_560;
          auVar159._16_4_ = local_560;
          auVar159._20_4_ = local_560;
          auVar159._24_4_ = local_560;
          auVar159._28_4_ = local_560;
          uVar171 = vcmpps_avx512vl(local_5e0,auVar224,2);
          uVar27 = vcmpps_avx512vl(auVar159,local_5e0,2);
          bVar86 = (byte)uVar171 & (byte)uVar27 & bVar86;
          if (bVar86 != 0) {
            uVar87 = vcmpps_avx512vl(ZEXT1632(auVar91),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar87 = bVar86 & uVar87;
            if ((char)uVar87 != '\0') {
              fVar175 = auVar108._0_4_ * fVar176;
              fVar183 = auVar108._4_4_ * fVar168;
              auVar49._4_4_ = fVar183;
              auVar49._0_4_ = fVar175;
              fVar88 = auVar108._8_4_ * fVar169;
              auVar49._8_4_ = fVar88;
              fVar89 = auVar108._12_4_ * fVar170;
              auVar49._12_4_ = fVar89;
              fVar140 = auVar108._16_4_ * 0.0;
              auVar49._16_4_ = fVar140;
              fVar141 = auVar108._20_4_ * 0.0;
              auVar49._20_4_ = fVar141;
              fVar142 = auVar108._24_4_ * 0.0;
              auVar49._24_4_ = fVar142;
              auVar49._28_4_ = auVar108._28_4_;
              auVar103 = vsubps_avx512vl(auVar100,auVar49);
              local_3e0._0_4_ =
                   (float)((uint)(bVar77 & 1) * (int)fVar175 |
                          (uint)!(bool)(bVar77 & 1) * auVar103._0_4_);
              bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
              local_3e0._4_4_ =
                   (float)((uint)bVar19 * (int)fVar183 | (uint)!bVar19 * auVar103._4_4_);
              bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
              local_3e0._8_4_ = (float)((uint)bVar19 * (int)fVar88 | (uint)!bVar19 * auVar103._8_4_)
              ;
              bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
              local_3e0._12_4_ =
                   (float)((uint)bVar19 * (int)fVar89 | (uint)!bVar19 * auVar103._12_4_);
              bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
              local_3e0._16_4_ =
                   (float)((uint)bVar19 * (int)fVar140 | (uint)!bVar19 * auVar103._16_4_);
              bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
              local_3e0._20_4_ =
                   (float)((uint)bVar19 * (int)fVar141 | (uint)!bVar19 * auVar103._20_4_);
              bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
              local_3e0._24_4_ =
                   (float)((uint)bVar19 * (int)fVar142 | (uint)!bVar19 * auVar103._24_4_);
              bVar19 = SUB81(uVar78 >> 7,0);
              local_3e0._28_4_ =
                   (float)((uint)bVar19 * auVar108._28_4_ | (uint)!bVar19 * auVar103._28_4_);
              auVar103 = vsubps_avx(ZEXT1632(auVar172),auVar99);
              auVar90 = vfmadd213ps_fma(auVar103,local_3e0,auVar99);
              uVar151 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar29._4_4_ = uVar151;
              auVar29._0_4_ = uVar151;
              auVar29._8_4_ = uVar151;
              auVar29._12_4_ = uVar151;
              auVar29._16_4_ = uVar151;
              auVar29._20_4_ = uVar151;
              auVar29._24_4_ = uVar151;
              auVar29._28_4_ = uVar151;
              auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                            CONCAT48(auVar90._8_4_ + auVar90._8_4_,
                                                                     CONCAT44(auVar90._4_4_ +
                                                                              auVar90._4_4_,
                                                                              auVar90._0_4_ +
                                                                              auVar90._0_4_)))),
                                         auVar29);
              uVar26 = vcmpps_avx512vl(local_5e0,auVar103,6);
              uVar87 = uVar87 & uVar26;
              bVar86 = (byte)uVar87;
              if (bVar86 != 0) {
                auVar182._0_4_ = auVar101._0_4_ * fVar176;
                auVar182._4_4_ = auVar101._4_4_ * fVar168;
                auVar182._8_4_ = auVar101._8_4_ * fVar169;
                auVar182._12_4_ = auVar101._12_4_ * fVar170;
                auVar182._16_4_ = auVar101._16_4_ * 0.0;
                auVar182._20_4_ = auVar101._20_4_ * 0.0;
                auVar182._24_4_ = auVar101._24_4_ * 0.0;
                auVar182._28_4_ = 0;
                auVar103 = vsubps_avx512vl(auVar100,auVar182);
                auVar125._0_4_ =
                     (uint)(bVar77 & 1) * (int)auVar182._0_4_ |
                     (uint)!(bool)(bVar77 & 1) * auVar103._0_4_;
                bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
                auVar125._4_4_ = (uint)bVar19 * (int)auVar182._4_4_ | (uint)!bVar19 * auVar103._4_4_
                ;
                bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
                auVar125._8_4_ = (uint)bVar19 * (int)auVar182._8_4_ | (uint)!bVar19 * auVar103._8_4_
                ;
                bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
                auVar125._12_4_ =
                     (uint)bVar19 * (int)auVar182._12_4_ | (uint)!bVar19 * auVar103._12_4_;
                bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
                auVar125._16_4_ =
                     (uint)bVar19 * (int)auVar182._16_4_ | (uint)!bVar19 * auVar103._16_4_;
                bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
                auVar125._20_4_ =
                     (uint)bVar19 * (int)auVar182._20_4_ | (uint)!bVar19 * auVar103._20_4_;
                bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
                auVar125._24_4_ =
                     (uint)bVar19 * (int)auVar182._24_4_ | (uint)!bVar19 * auVar103._24_4_;
                auVar125._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar103._28_4_;
                auVar30._8_4_ = 0x40000000;
                auVar30._0_8_ = 0x4000000040000000;
                auVar30._12_4_ = 0x40000000;
                auVar30._16_4_ = 0x40000000;
                auVar30._20_4_ = 0x40000000;
                auVar30._24_4_ = 0x40000000;
                auVar30._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar125,auVar100,auVar30);
                local_380 = 0;
                local_370 = local_670;
                uStack_368 = uStack_668;
                local_360 = local_680;
                uStack_358 = uStack_678;
                local_350 = local_690;
                uStack_348 = uStack_688;
                local_340 = local_6a0;
                uStack_338 = uStack_698;
                if ((pGVar83->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar176 = 1.0 / auVar213._0_4_;
                  local_320[0] = fVar176 * (local_3e0._0_4_ + 0.0);
                  local_320[1] = fVar176 * (local_3e0._4_4_ + 1.0);
                  local_320[2] = fVar176 * (local_3e0._8_4_ + 2.0);
                  local_320[3] = fVar176 * (local_3e0._12_4_ + 3.0);
                  fStack_310 = fVar176 * (local_3e0._16_4_ + 4.0);
                  fStack_30c = fVar176 * (local_3e0._20_4_ + 5.0);
                  fStack_308 = fVar176 * (local_3e0._24_4_ + 6.0);
                  fStack_304 = local_3e0._28_4_ + 7.0;
                  local_300 = local_3c0;
                  local_2e0 = local_5e0;
                  auVar160._8_4_ = 0x7f800000;
                  auVar160._0_8_ = 0x7f8000007f800000;
                  auVar160._12_4_ = 0x7f800000;
                  auVar160._16_4_ = 0x7f800000;
                  auVar160._20_4_ = 0x7f800000;
                  auVar160._24_4_ = 0x7f800000;
                  auVar160._28_4_ = 0x7f800000;
                  auVar103 = vblendmps_avx512vl(auVar160,local_5e0);
                  auVar126._0_4_ =
                       (uint)(bVar86 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar126._4_4_ = (uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar126._8_4_ = (uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar126._12_4_ = (uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar87 >> 4) & 1);
                  auVar126._16_4_ = (uint)bVar19 * auVar103._16_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar87 >> 5) & 1);
                  auVar126._20_4_ = (uint)bVar19 * auVar103._20_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar87 >> 6) & 1);
                  auVar126._24_4_ = (uint)bVar19 * auVar103._24_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = SUB81(uVar87 >> 7,0);
                  auVar126._28_4_ = (uint)bVar19 * auVar103._28_4_ | (uint)!bVar19 * 0x7f800000;
                  auVar103 = vshufps_avx(auVar126,auVar126,0xb1);
                  auVar103 = vminps_avx(auVar126,auVar103);
                  auVar102 = vshufpd_avx(auVar103,auVar103,5);
                  auVar103 = vminps_avx(auVar103,auVar102);
                  auVar102 = vpermpd_avx2(auVar103,0x4e);
                  auVar103 = vminps_avx(auVar103,auVar102);
                  uVar171 = vcmpps_avx512vl(auVar126,auVar103,0);
                  uVar79 = (uint)uVar87;
                  if (((byte)uVar171 & bVar86) != 0) {
                    uVar79 = (uint)((byte)uVar171 & bVar86);
                  }
                  uVar80 = 0;
                  for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                    uVar80 = uVar80 + 1;
                  }
                  uVar78 = (ulong)uVar80;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_500 = vpbroadcastd_avx512vl();
                    local_520 = vpbroadcastd_avx512vl();
                    local_3a0 = local_5e0;
                    local_37c = iVar14;
                    do {
                      auVar94 = auVar230._0_16_;
                      local_1c0 = local_320[uVar78];
                      local_1a0 = *(undefined4 *)(local_300 + uVar78 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar78 * 4)
                      ;
                      local_660.context = context->user;
                      fVar168 = 1.0 - local_1c0;
                      fVar176 = fVar168 * fVar168 * -3.0;
                      auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar168 * fVar168)),
                                                ZEXT416((uint)(local_1c0 * fVar168)),
                                                ZEXT416(0xc0000000));
                      auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar168)),
                                                ZEXT416((uint)(local_1c0 * local_1c0)),
                                                ZEXT416(0x40000000));
                      fVar168 = auVar90._0_4_ * 3.0;
                      fVar169 = auVar91._0_4_ * 3.0;
                      fVar170 = local_1c0 * local_1c0 * 3.0;
                      auVar201._0_4_ = fVar170 * fVar149;
                      auVar201._4_4_ = fVar170 * fVar150;
                      auVar201._8_4_ = fVar170 * fVar166;
                      auVar201._12_4_ = fVar170 * fVar167;
                      auVar155._4_4_ = fVar169;
                      auVar155._0_4_ = fVar169;
                      auVar155._8_4_ = fVar169;
                      auVar155._12_4_ = fVar169;
                      auVar90 = vfmadd132ps_fma(auVar155,auVar201,auVar92);
                      auVar188._4_4_ = fVar168;
                      auVar188._0_4_ = fVar168;
                      auVar188._8_4_ = fVar168;
                      auVar188._12_4_ = fVar168;
                      auVar90 = vfmadd132ps_fma(auVar188,auVar90,auVar7);
                      auVar156._4_4_ = fVar176;
                      auVar156._0_4_ = fVar176;
                      auVar156._8_4_ = fVar176;
                      auVar156._12_4_ = fVar176;
                      auVar90 = vfmadd132ps_fma(auVar156,auVar90,auVar6);
                      local_220 = auVar90._0_4_;
                      auVar195._8_4_ = 1;
                      auVar195._0_8_ = 0x100000001;
                      auVar195._12_4_ = 1;
                      auVar195._16_4_ = 1;
                      auVar195._20_4_ = 1;
                      auVar195._24_4_ = 1;
                      auVar195._28_4_ = 1;
                      local_200 = vpermps_avx2(auVar195,ZEXT1632(auVar90));
                      auVar196 = ZEXT3264(local_200);
                      auVar202._8_4_ = 2;
                      auVar202._0_8_ = 0x200000002;
                      auVar202._12_4_ = 2;
                      auVar205._16_4_ = 2;
                      auVar205._0_16_ = auVar202;
                      auVar205._20_4_ = 2;
                      auVar205._24_4_ = 2;
                      auVar205._28_4_ = 2;
                      auVar206 = ZEXT3264(auVar205);
                      local_1e0 = vpermps_avx2(auVar205,ZEXT1632(auVar90));
                      iStack_21c = local_220;
                      iStack_218 = local_220;
                      iStack_214 = local_220;
                      iStack_210 = local_220;
                      iStack_20c = local_220;
                      iStack_208 = local_220;
                      iStack_204 = local_220;
                      fStack_1bc = local_1c0;
                      fStack_1b8 = local_1c0;
                      fStack_1b4 = local_1c0;
                      fStack_1b0 = local_1c0;
                      fStack_1ac = local_1c0;
                      fStack_1a8 = local_1c0;
                      fStack_1a4 = local_1c0;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_520._0_8_;
                      uStack_178 = local_520._8_8_;
                      uStack_170 = local_520._16_8_;
                      uStack_168 = local_520._24_8_;
                      local_160 = local_500;
                      auVar103 = vpcmpeqd_avx2(local_500,local_500);
                      local_628[1] = auVar103;
                      *local_628 = auVar103;
                      local_140 = (local_660.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_660.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_620 = local_2c0;
                      local_660.valid = (int *)local_620;
                      local_660.geometryUserPtr = pGVar83->userPtr;
                      local_660.hit = (RTCHitN *)&local_220;
                      local_660.N = 8;
                      local_5a0 = auVar227._0_32_;
                      local_660.ray = (RTCRayN *)ray;
                      if (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar196 = ZEXT1664(local_200._0_16_);
                        auVar206 = ZEXT1664(auVar202);
                        (*pGVar83->intersectionFilterN)(&local_660);
                        auVar210 = ZEXT3264(local_5e0);
                        auVar227 = ZEXT3264(local_5a0);
                        auVar90 = vxorps_avx512vl(auVar94,auVar94);
                        auVar230 = ZEXT1664(auVar90);
                        auVar229 = ZEXT464(0xbf800000);
                        auVar228 = ZEXT3264(local_540);
                      }
                      auVar90 = auVar230._0_16_;
                      if (local_620 == (undefined1  [32])0x0) {
LAB_01dda37c:
                        *(int *)(ray + k * 4 + 0x100) = auVar227._0_4_;
                      }
                      else {
                        p_Var18 = context->args->filter;
                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar83->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar196 = ZEXT1664(auVar196._0_16_);
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          (*p_Var18)(&local_660);
                          auVar210 = ZEXT3264(local_5e0);
                          auVar227 = ZEXT3264(local_5a0);
                          auVar90 = vxorps_avx512vl(auVar90,auVar90);
                          auVar230 = ZEXT1664(auVar90);
                          auVar229 = ZEXT464(0xbf800000);
                          auVar228 = ZEXT3264(local_540);
                        }
                        if (local_620 == (undefined1  [32])0x0) goto LAB_01dda37c;
                        uVar26 = vptestmd_avx512vl(local_620,local_620);
                        iVar1 = *(int *)(local_660.hit + 4);
                        iVar2 = *(int *)(local_660.hit + 8);
                        iVar70 = *(int *)(local_660.hit + 0xc);
                        iVar71 = *(int *)(local_660.hit + 0x10);
                        iVar72 = *(int *)(local_660.hit + 0x14);
                        iVar73 = *(int *)(local_660.hit + 0x18);
                        iVar74 = *(int *)(local_660.hit + 0x1c);
                        bVar86 = (byte)uVar26;
                        bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                        bVar25 = SUB81(uVar26 >> 7,0);
                        *(uint *)(local_660.ray + 0x180) =
                             (uint)(bVar86 & 1) * *(int *)local_660.hit |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x180);
                        *(uint *)(local_660.ray + 0x184) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_660.ray + 0x184);
                        *(uint *)(local_660.ray + 0x188) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_660.ray + 0x188);
                        *(uint *)(local_660.ray + 0x18c) =
                             (uint)bVar21 * iVar70 | (uint)!bVar21 * *(int *)(local_660.ray + 0x18c)
                        ;
                        *(uint *)(local_660.ray + 400) =
                             (uint)bVar22 * iVar71 | (uint)!bVar22 * *(int *)(local_660.ray + 400);
                        *(uint *)(local_660.ray + 0x194) =
                             (uint)bVar23 * iVar72 | (uint)!bVar23 * *(int *)(local_660.ray + 0x194)
                        ;
                        *(uint *)(local_660.ray + 0x198) =
                             (uint)bVar24 * iVar73 | (uint)!bVar24 * *(int *)(local_660.ray + 0x198)
                        ;
                        *(uint *)(local_660.ray + 0x19c) =
                             (uint)bVar25 * iVar74 | (uint)!bVar25 * *(int *)(local_660.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x24);
                        iVar2 = *(int *)(local_660.hit + 0x28);
                        iVar70 = *(int *)(local_660.hit + 0x2c);
                        iVar71 = *(int *)(local_660.hit + 0x30);
                        iVar72 = *(int *)(local_660.hit + 0x34);
                        iVar73 = *(int *)(local_660.hit + 0x38);
                        iVar74 = *(int *)(local_660.hit + 0x3c);
                        bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                        bVar25 = SUB81(uVar26 >> 7,0);
                        *(uint *)(local_660.ray + 0x1a0) =
                             (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x20) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1a0);
                        *(uint *)(local_660.ray + 0x1a4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1a4);
                        *(uint *)(local_660.ray + 0x1a8) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_660.ray + 0x1a8);
                        *(uint *)(local_660.ray + 0x1ac) =
                             (uint)bVar21 * iVar70 | (uint)!bVar21 * *(int *)(local_660.ray + 0x1ac)
                        ;
                        *(uint *)(local_660.ray + 0x1b0) =
                             (uint)bVar22 * iVar71 | (uint)!bVar22 * *(int *)(local_660.ray + 0x1b0)
                        ;
                        *(uint *)(local_660.ray + 0x1b4) =
                             (uint)bVar23 * iVar72 | (uint)!bVar23 * *(int *)(local_660.ray + 0x1b4)
                        ;
                        *(uint *)(local_660.ray + 0x1b8) =
                             (uint)bVar24 * iVar73 | (uint)!bVar24 * *(int *)(local_660.ray + 0x1b8)
                        ;
                        *(uint *)(local_660.ray + 0x1bc) =
                             (uint)bVar25 * iVar74 | (uint)!bVar25 * *(int *)(local_660.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x44);
                        iVar2 = *(int *)(local_660.hit + 0x48);
                        iVar70 = *(int *)(local_660.hit + 0x4c);
                        iVar71 = *(int *)(local_660.hit + 0x50);
                        iVar72 = *(int *)(local_660.hit + 0x54);
                        iVar73 = *(int *)(local_660.hit + 0x58);
                        iVar74 = *(int *)(local_660.hit + 0x5c);
                        bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                        bVar25 = SUB81(uVar26 >> 7,0);
                        *(uint *)(local_660.ray + 0x1c0) =
                             (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x40) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1c0);
                        *(uint *)(local_660.ray + 0x1c4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1c4);
                        *(uint *)(local_660.ray + 0x1c8) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_660.ray + 0x1c8);
                        *(uint *)(local_660.ray + 0x1cc) =
                             (uint)bVar21 * iVar70 | (uint)!bVar21 * *(int *)(local_660.ray + 0x1cc)
                        ;
                        *(uint *)(local_660.ray + 0x1d0) =
                             (uint)bVar22 * iVar71 | (uint)!bVar22 * *(int *)(local_660.ray + 0x1d0)
                        ;
                        *(uint *)(local_660.ray + 0x1d4) =
                             (uint)bVar23 * iVar72 | (uint)!bVar23 * *(int *)(local_660.ray + 0x1d4)
                        ;
                        *(uint *)(local_660.ray + 0x1d8) =
                             (uint)bVar24 * iVar73 | (uint)!bVar24 * *(int *)(local_660.ray + 0x1d8)
                        ;
                        *(uint *)(local_660.ray + 0x1dc) =
                             (uint)bVar25 * iVar74 | (uint)!bVar25 * *(int *)(local_660.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 100);
                        iVar2 = *(int *)(local_660.hit + 0x68);
                        iVar70 = *(int *)(local_660.hit + 0x6c);
                        iVar71 = *(int *)(local_660.hit + 0x70);
                        iVar72 = *(int *)(local_660.hit + 0x74);
                        iVar73 = *(int *)(local_660.hit + 0x78);
                        iVar74 = *(int *)(local_660.hit + 0x7c);
                        bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                        bVar25 = SUB81(uVar26 >> 7,0);
                        *(uint *)(local_660.ray + 0x1e0) =
                             (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x60) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1e0);
                        *(uint *)(local_660.ray + 0x1e4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1e4);
                        *(uint *)(local_660.ray + 0x1e8) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_660.ray + 0x1e8);
                        *(uint *)(local_660.ray + 0x1ec) =
                             (uint)bVar21 * iVar70 | (uint)!bVar21 * *(int *)(local_660.ray + 0x1ec)
                        ;
                        *(uint *)(local_660.ray + 0x1f0) =
                             (uint)bVar22 * iVar71 | (uint)!bVar22 * *(int *)(local_660.ray + 0x1f0)
                        ;
                        *(uint *)(local_660.ray + 500) =
                             (uint)bVar23 * iVar72 | (uint)!bVar23 * *(int *)(local_660.ray + 500);
                        *(uint *)(local_660.ray + 0x1f8) =
                             (uint)bVar24 * iVar73 | (uint)!bVar24 * *(int *)(local_660.ray + 0x1f8)
                        ;
                        *(uint *)(local_660.ray + 0x1fc) =
                             (uint)bVar25 * iVar74 | (uint)!bVar25 * *(int *)(local_660.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x84);
                        iVar2 = *(int *)(local_660.hit + 0x88);
                        iVar70 = *(int *)(local_660.hit + 0x8c);
                        iVar71 = *(int *)(local_660.hit + 0x90);
                        iVar72 = *(int *)(local_660.hit + 0x94);
                        iVar73 = *(int *)(local_660.hit + 0x98);
                        iVar74 = *(int *)(local_660.hit + 0x9c);
                        bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                        bVar25 = SUB81(uVar26 >> 7,0);
                        *(uint *)(local_660.ray + 0x200) =
                             (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x80) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x200);
                        *(uint *)(local_660.ray + 0x204) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_660.ray + 0x204);
                        *(uint *)(local_660.ray + 0x208) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_660.ray + 0x208);
                        *(uint *)(local_660.ray + 0x20c) =
                             (uint)bVar21 * iVar70 | (uint)!bVar21 * *(int *)(local_660.ray + 0x20c)
                        ;
                        *(uint *)(local_660.ray + 0x210) =
                             (uint)bVar22 * iVar71 | (uint)!bVar22 * *(int *)(local_660.ray + 0x210)
                        ;
                        *(uint *)(local_660.ray + 0x214) =
                             (uint)bVar23 * iVar72 | (uint)!bVar23 * *(int *)(local_660.ray + 0x214)
                        ;
                        *(uint *)(local_660.ray + 0x218) =
                             (uint)bVar24 * iVar73 | (uint)!bVar24 * *(int *)(local_660.ray + 0x218)
                        ;
                        *(uint *)(local_660.ray + 0x21c) =
                             (uint)bVar25 * iVar74 | (uint)!bVar25 * *(int *)(local_660.ray + 0x21c)
                        ;
                        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0));
                        *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar103;
                        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0));
                        *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar103;
                        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0));
                        *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar103;
                        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar103;
                        auVar227 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      bVar86 = ~(byte)(1 << ((uint)uVar78 & 0x1f)) & (byte)uVar87;
                      uVar151 = auVar227._0_4_;
                      auVar164._4_4_ = uVar151;
                      auVar164._0_4_ = uVar151;
                      auVar164._8_4_ = uVar151;
                      auVar164._12_4_ = uVar151;
                      auVar164._16_4_ = uVar151;
                      auVar164._20_4_ = uVar151;
                      auVar164._24_4_ = uVar151;
                      auVar164._28_4_ = uVar151;
                      uVar171 = vcmpps_avx512vl(auVar210._0_32_,auVar164,2);
                      if ((bVar86 & (byte)uVar171) == 0) goto LAB_01dd92ff;
                      bVar86 = bVar86 & (byte)uVar171;
                      uVar87 = (ulong)bVar86;
                      auVar165._8_4_ = 0x7f800000;
                      auVar165._0_8_ = 0x7f8000007f800000;
                      auVar165._12_4_ = 0x7f800000;
                      auVar165._16_4_ = 0x7f800000;
                      auVar165._20_4_ = 0x7f800000;
                      auVar165._24_4_ = 0x7f800000;
                      auVar165._28_4_ = 0x7f800000;
                      auVar103 = vblendmps_avx512vl(auVar165,auVar210._0_32_);
                      auVar139._0_4_ =
                           (uint)(bVar86 & 1) * auVar103._0_4_ |
                           (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                      bVar19 = (bool)(bVar86 >> 1 & 1);
                      auVar139._4_4_ = (uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar86 >> 2 & 1);
                      auVar139._8_4_ = (uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar86 >> 3 & 1);
                      auVar139._12_4_ = (uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar86 >> 4 & 1);
                      auVar139._16_4_ = (uint)bVar19 * auVar103._16_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar86 >> 5 & 1);
                      auVar139._20_4_ = (uint)bVar19 * auVar103._20_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar86 >> 6 & 1);
                      auVar139._24_4_ = (uint)bVar19 * auVar103._24_4_ | (uint)!bVar19 * 0x7f800000;
                      auVar139._28_4_ =
                           (uint)(bVar86 >> 7) * auVar103._28_4_ |
                           (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                      auVar103 = vshufps_avx(auVar139,auVar139,0xb1);
                      auVar103 = vminps_avx(auVar139,auVar103);
                      auVar102 = vshufpd_avx(auVar103,auVar103,5);
                      auVar103 = vminps_avx(auVar103,auVar102);
                      auVar102 = vpermpd_avx2(auVar103,0x4e);
                      auVar103 = vminps_avx(auVar103,auVar102);
                      uVar171 = vcmpps_avx512vl(auVar139,auVar103,0);
                      bVar77 = (byte)uVar171 & bVar86;
                      if (bVar77 != 0) {
                        bVar86 = bVar77;
                      }
                      uVar79 = 0;
                      for (uVar80 = (uint)bVar86; (uVar80 & 1) == 0;
                          uVar80 = uVar80 >> 1 | 0x80000000) {
                        uVar79 = uVar79 + 1;
                      }
                      uVar78 = (ulong)uVar79;
                    } while( true );
                  }
                  fVar176 = local_320[uVar78];
                  uVar151 = *(undefined4 *)(local_300 + uVar78 * 4);
                  fVar169 = 1.0 - fVar176;
                  fVar168 = fVar169 * fVar169 * -3.0;
                  auVar196 = ZEXT464((uint)fVar168);
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 * fVar169)),
                                            ZEXT416((uint)(fVar176 * fVar169)),ZEXT416(0xc0000000));
                  auVar91 = vfmsub132ss_fma(ZEXT416((uint)(fVar176 * fVar169)),
                                            ZEXT416((uint)(fVar176 * fVar176)),ZEXT416(0x40000000));
                  fVar169 = auVar90._0_4_ * 3.0;
                  fVar170 = auVar91._0_4_ * 3.0;
                  fVar175 = fVar176 * fVar176 * 3.0;
                  auVar197._0_4_ = fVar175 * fVar149;
                  auVar197._4_4_ = fVar175 * fVar150;
                  auVar197._8_4_ = fVar175 * fVar166;
                  auVar197._12_4_ = fVar175 * fVar167;
                  auVar206 = ZEXT1664(auVar197);
                  auVar177._4_4_ = fVar170;
                  auVar177._0_4_ = fVar170;
                  auVar177._8_4_ = fVar170;
                  auVar177._12_4_ = fVar170;
                  auVar90 = vfmadd132ps_fma(auVar177,auVar197,auVar92);
                  auVar185._4_4_ = fVar169;
                  auVar185._0_4_ = fVar169;
                  auVar185._8_4_ = fVar169;
                  auVar185._12_4_ = fVar169;
                  auVar90 = vfmadd132ps_fma(auVar185,auVar90,auVar7);
                  auVar178._4_4_ = fVar168;
                  auVar178._0_4_ = fVar168;
                  auVar178._8_4_ = fVar168;
                  auVar178._12_4_ = fVar168;
                  auVar90 = vfmadd132ps_fma(auVar178,auVar90,auVar6);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar78 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar90._0_4_;
                  uVar15 = vextractps_avx(auVar90,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar15;
                  uVar15 = vextractps_avx(auVar90,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar15;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar176;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar151;
                  *(uint *)(ray + k * 4 + 0x220) = uVar13;
                  *(uint *)(ray + k * 4 + 0x240) = uVar84;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01dd92ff:
      if (8 < iVar14) {
        local_5a0 = vpbroadcastd_avx512vl();
        local_500._4_4_ = local_5c0._0_4_;
        local_500._0_4_ = local_5c0._0_4_;
        local_500._8_4_ = local_5c0._0_4_;
        local_500._12_4_ = local_5c0._0_4_;
        local_500._16_4_ = local_5c0._0_4_;
        local_500._20_4_ = local_5c0._0_4_;
        local_500._24_4_ = local_5c0._0_4_;
        local_500._28_4_ = local_5c0._0_4_;
        uStack_55c = local_560;
        uStack_558 = local_560;
        uStack_554 = local_560;
        uStack_550 = local_560;
        uStack_54c = local_560;
        uStack_548 = local_560;
        uStack_544 = local_560;
        local_100 = 1.0 / (float)local_580._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_580 = vpbroadcastd_avx512vl();
        local_520 = vpbroadcastd_avx512vl();
        lVar81 = 8;
LAB_01dd93b5:
        auVar103 = vpbroadcastd_avx512vl();
        auVar103 = vpor_avx2(auVar103,_DAT_01fe9900);
        uVar27 = vpcmpd_avx512vl(auVar103,local_5a0,1);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar81 * 4 + lVar28);
        auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21aa768 + lVar81 * 4);
        auVar114 = *(undefined1 (*) [32])(lVar28 + 0x21aabec + lVar81 * 4);
        auVar113 = *(undefined1 (*) [32])(lVar28 + 0x21ab070 + lVar81 * 4);
        fVar176 = auVar113._0_4_;
        auVar227._0_4_ = fVar176 * (float)local_4c0._0_4_;
        fVar168 = auVar113._4_4_;
        auVar227._4_4_ = fVar168 * (float)local_4c0._4_4_;
        fVar169 = auVar113._8_4_;
        auVar227._8_4_ = fVar169 * fStack_4b8;
        fVar170 = auVar113._12_4_;
        auVar227._12_4_ = fVar170 * fStack_4b4;
        fVar175 = auVar113._16_4_;
        auVar227._16_4_ = fVar175 * fStack_4b0;
        fVar183 = auVar113._20_4_;
        auVar227._20_4_ = fVar183 * fStack_4ac;
        auVar227._28_36_ = auVar206._28_36_;
        fVar88 = auVar113._24_4_;
        auVar227._24_4_ = fVar88 * fStack_4a8;
        auVar206._0_4_ = fVar176 * (float)local_4e0._0_4_;
        auVar206._4_4_ = fVar168 * (float)local_4e0._4_4_;
        auVar206._8_4_ = fVar169 * fStack_4d8;
        auVar206._12_4_ = fVar170 * fStack_4d4;
        auVar206._16_4_ = fVar175 * fStack_4d0;
        auVar206._20_4_ = fVar183 * fStack_4cc;
        auVar206._28_36_ = auVar196._28_36_;
        auVar206._24_4_ = fVar88 * fStack_4c8;
        auVar104 = vmulps_avx512vl(local_e0,auVar113);
        auVar105 = vfmadd231ps_avx512vl(auVar227._0_32_,auVar114,local_480);
        auVar112 = vfmadd231ps_avx512vl(auVar206._0_32_,auVar114,local_4a0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_c0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_440);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar102,local_460);
        auVar106 = vfmadd231ps_avx512vl(auVar104,auVar102,local_a0);
        auVar90 = vfmadd231ps_fma(auVar105,auVar103,local_400);
        auVar206 = ZEXT1664(auVar90);
        auVar91 = vfmadd231ps_fma(auVar112,auVar103,local_420);
        auVar196 = ZEXT1664(auVar91);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar81 * 4 + lVar28);
        auVar105 = *(undefined1 (*) [32])(lVar28 + 0x21acb88 + lVar81 * 4);
        auVar108 = vfmadd231ps_avx512vl(auVar106,auVar103,local_80);
        auVar112 = *(undefined1 (*) [32])(lVar28 + 0x21ad00c + lVar81 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar28 + 0x21ad490 + lVar81 * 4);
        fVar89 = auVar106._0_4_;
        auVar211._0_4_ = fVar89 * (float)local_4c0._0_4_;
        fVar140 = auVar106._4_4_;
        auVar211._4_4_ = fVar140 * (float)local_4c0._4_4_;
        fVar141 = auVar106._8_4_;
        auVar211._8_4_ = fVar141 * fStack_4b8;
        fVar142 = auVar106._12_4_;
        auVar211._12_4_ = fVar142 * fStack_4b4;
        fVar143 = auVar106._16_4_;
        auVar211._16_4_ = fVar143 * fStack_4b0;
        fVar145 = auVar106._20_4_;
        auVar211._20_4_ = fVar145 * fStack_4ac;
        auVar211._28_36_ = auVar210._28_36_;
        fVar146 = auVar106._24_4_;
        auVar211._24_4_ = fVar146 * fStack_4a8;
        auVar50._4_4_ = fVar140 * (float)local_4e0._4_4_;
        auVar50._0_4_ = fVar89 * (float)local_4e0._0_4_;
        auVar50._8_4_ = fVar141 * fStack_4d8;
        auVar50._12_4_ = fVar142 * fStack_4d4;
        auVar50._16_4_ = fVar143 * fStack_4d0;
        auVar50._20_4_ = fVar145 * fStack_4cc;
        auVar50._24_4_ = fVar146 * fStack_4c8;
        auVar50._28_4_ = uStack_4c4;
        auVar107 = vmulps_avx512vl(local_e0,auVar106);
        auVar101 = vfmadd231ps_avx512vl(auVar211._0_32_,auVar112,local_480);
        auVar109 = vfmadd231ps_avx512vl(auVar50,auVar112,local_4a0);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,local_c0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_440);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_460);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_a0);
        auVar94 = vfmadd231ps_fma(auVar101,auVar104,local_400);
        auVar210 = ZEXT1664(auVar94);
        auVar8 = vfmadd231ps_fma(auVar109,auVar104,local_420);
        auVar101 = vfmadd231ps_avx512vl(auVar107,auVar104,local_80);
        auVar109 = vmaxps_avx512vl(auVar108,auVar101);
        auVar107 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar90));
        auVar110 = vsubps_avx512vl(ZEXT1632(auVar8),ZEXT1632(auVar91));
        auVar99 = vmulps_avx512vl(ZEXT1632(auVar91),auVar107);
        auVar100 = vmulps_avx512vl(ZEXT1632(auVar90),auVar110);
        auVar99 = vsubps_avx512vl(auVar99,auVar100);
        auVar100 = vmulps_avx512vl(auVar110,auVar110);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,auVar107);
        auVar109 = vmulps_avx512vl(auVar109,auVar109);
        auVar109 = vmulps_avx512vl(auVar109,auVar100);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        uVar171 = vcmpps_avx512vl(auVar99,auVar109,2);
        bVar86 = (byte)uVar27 & (byte)uVar171;
        if (bVar86 != 0) {
          fVar144 = local_2a0._0_4_;
          fVar147 = local_2a0._4_4_;
          auVar51._4_4_ = fVar147 * fVar140;
          auVar51._0_4_ = fVar144 * fVar89;
          fVar89 = local_2a0._8_4_;
          auVar51._8_4_ = fVar89 * fVar141;
          fVar140 = local_2a0._12_4_;
          auVar51._12_4_ = fVar140 * fVar142;
          fVar141 = local_2a0._16_4_;
          auVar51._16_4_ = fVar141 * fVar143;
          fVar142 = local_2a0._20_4_;
          auVar51._20_4_ = fVar142 * fVar145;
          fVar143 = local_2a0._24_4_;
          auVar51._24_4_ = fVar143 * fVar146;
          auVar51._28_4_ = auVar106._28_4_;
          auVar112 = vfmadd213ps_avx512vl(auVar112,local_280,auVar51);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_260,auVar112);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_240,auVar105);
          auVar52._4_4_ = fVar147 * fVar168;
          auVar52._0_4_ = fVar144 * fVar176;
          auVar52._8_4_ = fVar89 * fVar169;
          auVar52._12_4_ = fVar140 * fVar170;
          auVar52._16_4_ = fVar141 * fVar175;
          auVar52._20_4_ = fVar142 * fVar183;
          auVar52._24_4_ = fVar143 * fVar88;
          auVar52._28_4_ = auVar113._28_4_;
          auVar114 = vfmadd213ps_avx512vl(auVar114,local_280,auVar52);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_260,auVar114);
          auVar105 = vfmadd213ps_avx512vl(auVar103,local_240,auVar102);
          auVar103 = *(undefined1 (*) [32])(lVar28 + 0x21ab4f4 + lVar81 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21ab978 + lVar81 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar28 + 0x21abdfc + lVar81 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar28 + 0x21ac280 + lVar81 * 4);
          auVar112 = vmulps_avx512vl(_local_4c0,auVar113);
          auVar106 = vmulps_avx512vl(_local_4e0,auVar113);
          auVar53._4_4_ = fVar147 * auVar113._4_4_;
          auVar53._0_4_ = fVar144 * auVar113._0_4_;
          auVar53._8_4_ = fVar89 * auVar113._8_4_;
          auVar53._12_4_ = fVar140 * auVar113._12_4_;
          auVar53._16_4_ = fVar141 * auVar113._16_4_;
          auVar53._20_4_ = fVar142 * auVar113._20_4_;
          auVar53._24_4_ = fVar143 * auVar113._24_4_;
          auVar53._28_4_ = auVar113._28_4_;
          auVar113 = vfmadd231ps_avx512vl(auVar112,auVar114,local_480);
          auVar112 = vfmadd231ps_avx512vl(auVar106,auVar114,local_4a0);
          auVar114 = vfmadd231ps_avx512vl(auVar53,local_280,auVar114);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,local_440);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar102,local_460);
          auVar102 = vfmadd231ps_avx512vl(auVar114,local_260,auVar102);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,local_400);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,local_420);
          auVar106 = vfmadd231ps_avx512vl(auVar102,local_240,auVar103);
          auVar103 = *(undefined1 (*) [32])(lVar28 + 0x21ad914 + lVar81 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21ae21c + lVar81 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar28 + 0x21ae6a0 + lVar81 * 4);
          auVar109 = vmulps_avx512vl(_local_4c0,auVar114);
          auVar99 = vmulps_avx512vl(_local_4e0,auVar114);
          auVar114 = vmulps_avx512vl(local_2a0,auVar114);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar102,local_480);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_4a0);
          auVar114 = vfmadd231ps_avx512vl(auVar114,local_280,auVar102);
          auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21add98 + lVar81 * 4);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar102,local_440);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_460);
          auVar102 = vfmadd231ps_avx512vl(auVar114,local_260,auVar102);
          auVar229 = ZEXT1664(auVar229._0_16_);
          auVar228 = ZEXT3264(auVar228._0_32_);
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar114 = vfmadd231ps_avx512vl(auVar109,auVar103,local_400);
          auVar109 = vfmadd231ps_avx512vl(auVar99,auVar103,local_420);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_240,auVar103);
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar113,auVar99);
          vandps_avx512vl(auVar112,auVar99);
          auVar103 = vmaxps_avx(auVar99,auVar99);
          vandps_avx512vl(auVar106,auVar99);
          auVar103 = vmaxps_avx(auVar103,auVar99);
          uVar78 = vcmpps_avx512vl(auVar103,local_500,1);
          bVar19 = (bool)((byte)uVar78 & 1);
          auVar127._0_4_ = (float)((uint)bVar19 * auVar107._0_4_ | (uint)!bVar19 * auVar113._0_4_);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar19 * auVar107._4_4_ | (uint)!bVar19 * auVar113._4_4_);
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar19 * auVar107._8_4_ | (uint)!bVar19 * auVar113._8_4_);
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar127._12_4_ =
               (float)((uint)bVar19 * auVar107._12_4_ | (uint)!bVar19 * auVar113._12_4_);
          bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar127._16_4_ =
               (float)((uint)bVar19 * auVar107._16_4_ | (uint)!bVar19 * auVar113._16_4_);
          bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar127._20_4_ =
               (float)((uint)bVar19 * auVar107._20_4_ | (uint)!bVar19 * auVar113._20_4_);
          bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar127._24_4_ =
               (float)((uint)bVar19 * auVar107._24_4_ | (uint)!bVar19 * auVar113._24_4_);
          bVar19 = SUB81(uVar78 >> 7,0);
          auVar127._28_4_ = (uint)bVar19 * auVar107._28_4_ | (uint)!bVar19 * auVar113._28_4_;
          bVar19 = (bool)((byte)uVar78 & 1);
          auVar128._0_4_ = (float)((uint)bVar19 * auVar110._0_4_ | (uint)!bVar19 * auVar112._0_4_);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar19 * auVar110._4_4_ | (uint)!bVar19 * auVar112._4_4_);
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar19 * auVar110._8_4_ | (uint)!bVar19 * auVar112._8_4_);
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar128._12_4_ =
               (float)((uint)bVar19 * auVar110._12_4_ | (uint)!bVar19 * auVar112._12_4_);
          bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar128._16_4_ =
               (float)((uint)bVar19 * auVar110._16_4_ | (uint)!bVar19 * auVar112._16_4_);
          bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar128._20_4_ =
               (float)((uint)bVar19 * auVar110._20_4_ | (uint)!bVar19 * auVar112._20_4_);
          bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar128._24_4_ =
               (float)((uint)bVar19 * auVar110._24_4_ | (uint)!bVar19 * auVar112._24_4_);
          bVar19 = SUB81(uVar78 >> 7,0);
          auVar128._28_4_ = (uint)bVar19 * auVar110._28_4_ | (uint)!bVar19 * auVar112._28_4_;
          vandps_avx512vl(auVar114,auVar99);
          vandps_avx512vl(auVar109,auVar99);
          auVar103 = vmaxps_avx(auVar128,auVar128);
          vandps_avx512vl(auVar102,auVar99);
          auVar103 = vmaxps_avx(auVar103,auVar128);
          uVar78 = vcmpps_avx512vl(auVar103,local_500,1);
          bVar19 = (bool)((byte)uVar78 & 1);
          auVar129._0_4_ = (uint)bVar19 * auVar107._0_4_ | (uint)!bVar19 * auVar114._0_4_;
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar19 * auVar107._4_4_ | (uint)!bVar19 * auVar114._4_4_;
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar19 * auVar107._8_4_ | (uint)!bVar19 * auVar114._8_4_;
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar19 * auVar107._12_4_ | (uint)!bVar19 * auVar114._12_4_;
          bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar19 * auVar107._16_4_ | (uint)!bVar19 * auVar114._16_4_;
          bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar19 * auVar107._20_4_ | (uint)!bVar19 * auVar114._20_4_;
          bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar19 * auVar107._24_4_ | (uint)!bVar19 * auVar114._24_4_;
          bVar19 = SUB81(uVar78 >> 7,0);
          auVar129._28_4_ = (uint)bVar19 * auVar107._28_4_ | (uint)!bVar19 * auVar114._28_4_;
          bVar19 = (bool)((byte)uVar78 & 1);
          auVar130._0_4_ = (float)((uint)bVar19 * auVar110._0_4_ | (uint)!bVar19 * auVar109._0_4_);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar19 * auVar110._4_4_ | (uint)!bVar19 * auVar109._4_4_);
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar19 * auVar110._8_4_ | (uint)!bVar19 * auVar109._8_4_);
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar130._12_4_ =
               (float)((uint)bVar19 * auVar110._12_4_ | (uint)!bVar19 * auVar109._12_4_);
          bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar130._16_4_ =
               (float)((uint)bVar19 * auVar110._16_4_ | (uint)!bVar19 * auVar109._16_4_);
          bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar130._20_4_ =
               (float)((uint)bVar19 * auVar110._20_4_ | (uint)!bVar19 * auVar109._20_4_);
          bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar130._24_4_ =
               (float)((uint)bVar19 * auVar110._24_4_ | (uint)!bVar19 * auVar109._24_4_);
          bVar19 = SUB81(uVar78 >> 7,0);
          auVar130._28_4_ = (uint)bVar19 * auVar110._28_4_ | (uint)!bVar19 * auVar109._28_4_;
          auVar216._8_4_ = 0x80000000;
          auVar216._0_8_ = 0x8000000080000000;
          auVar216._12_4_ = 0x80000000;
          auVar216._16_4_ = 0x80000000;
          auVar216._20_4_ = 0x80000000;
          auVar216._24_4_ = 0x80000000;
          auVar216._28_4_ = 0x80000000;
          auVar103 = vxorps_avx512vl(auVar129,auVar216);
          auVar98 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
          auVar102 = vfmadd213ps_avx512vl(auVar127,auVar127,ZEXT1632(auVar98));
          auVar9 = vfmadd231ps_fma(auVar102,auVar128,auVar128);
          auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar9));
          auVar225._8_4_ = 0xbf000000;
          auVar225._0_8_ = 0xbf000000bf000000;
          auVar225._12_4_ = 0xbf000000;
          auVar225._16_4_ = 0xbf000000;
          auVar225._20_4_ = 0xbf000000;
          auVar225._24_4_ = 0xbf000000;
          auVar225._28_4_ = 0xbf000000;
          fVar176 = auVar102._0_4_;
          fVar168 = auVar102._4_4_;
          fVar169 = auVar102._8_4_;
          fVar170 = auVar102._12_4_;
          fVar175 = auVar102._16_4_;
          fVar183 = auVar102._20_4_;
          fVar88 = auVar102._24_4_;
          auVar54._4_4_ = fVar168 * fVar168 * fVar168 * auVar9._4_4_ * -0.5;
          auVar54._0_4_ = fVar176 * fVar176 * fVar176 * auVar9._0_4_ * -0.5;
          auVar54._8_4_ = fVar169 * fVar169 * fVar169 * auVar9._8_4_ * -0.5;
          auVar54._12_4_ = fVar170 * fVar170 * fVar170 * auVar9._12_4_ * -0.5;
          auVar54._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
          auVar54._20_4_ = fVar183 * fVar183 * fVar183 * -0.0;
          auVar54._24_4_ = fVar88 * fVar88 * fVar88 * -0.0;
          auVar54._28_4_ = auVar128._28_4_;
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar102 = vfmadd231ps_avx512vl(auVar54,auVar114,auVar102);
          auVar55._4_4_ = auVar128._4_4_ * auVar102._4_4_;
          auVar55._0_4_ = auVar128._0_4_ * auVar102._0_4_;
          auVar55._8_4_ = auVar128._8_4_ * auVar102._8_4_;
          auVar55._12_4_ = auVar128._12_4_ * auVar102._12_4_;
          auVar55._16_4_ = auVar128._16_4_ * auVar102._16_4_;
          auVar55._20_4_ = auVar128._20_4_ * auVar102._20_4_;
          auVar55._24_4_ = auVar128._24_4_ * auVar102._24_4_;
          auVar55._28_4_ = 0;
          auVar56._4_4_ = auVar102._4_4_ * -auVar127._4_4_;
          auVar56._0_4_ = auVar102._0_4_ * -auVar127._0_4_;
          auVar56._8_4_ = auVar102._8_4_ * -auVar127._8_4_;
          auVar56._12_4_ = auVar102._12_4_ * -auVar127._12_4_;
          auVar56._16_4_ = auVar102._16_4_ * -auVar127._16_4_;
          auVar56._20_4_ = auVar102._20_4_ * -auVar127._20_4_;
          auVar56._24_4_ = auVar102._24_4_ * -auVar127._24_4_;
          auVar56._28_4_ = auVar128._28_4_;
          auVar113 = vmulps_avx512vl(auVar102,ZEXT1632(auVar98));
          auVar106 = ZEXT1632(auVar98);
          auVar102 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar106);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar130,auVar130);
          auVar112 = vrsqrt14ps_avx512vl(auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar225);
          fVar176 = auVar112._0_4_;
          fVar168 = auVar112._4_4_;
          fVar169 = auVar112._8_4_;
          fVar170 = auVar112._12_4_;
          fVar175 = auVar112._16_4_;
          fVar183 = auVar112._20_4_;
          fVar88 = auVar112._24_4_;
          auVar57._4_4_ = fVar168 * fVar168 * fVar168 * auVar102._4_4_;
          auVar57._0_4_ = fVar176 * fVar176 * fVar176 * auVar102._0_4_;
          auVar57._8_4_ = fVar169 * fVar169 * fVar169 * auVar102._8_4_;
          auVar57._12_4_ = fVar170 * fVar170 * fVar170 * auVar102._12_4_;
          auVar57._16_4_ = fVar175 * fVar175 * fVar175 * auVar102._16_4_;
          auVar57._20_4_ = fVar183 * fVar183 * fVar183 * auVar102._20_4_;
          auVar57._24_4_ = fVar88 * fVar88 * fVar88 * auVar102._24_4_;
          auVar57._28_4_ = auVar102._28_4_;
          auVar102 = vfmadd231ps_avx512vl(auVar57,auVar114,auVar112);
          auVar58._4_4_ = auVar130._4_4_ * auVar102._4_4_;
          auVar58._0_4_ = auVar130._0_4_ * auVar102._0_4_;
          auVar58._8_4_ = auVar130._8_4_ * auVar102._8_4_;
          auVar58._12_4_ = auVar130._12_4_ * auVar102._12_4_;
          auVar58._16_4_ = auVar130._16_4_ * auVar102._16_4_;
          auVar58._20_4_ = auVar130._20_4_ * auVar102._20_4_;
          auVar58._24_4_ = auVar130._24_4_ * auVar102._24_4_;
          auVar58._28_4_ = auVar112._28_4_;
          auVar59._4_4_ = auVar102._4_4_ * auVar103._4_4_;
          auVar59._0_4_ = auVar102._0_4_ * auVar103._0_4_;
          auVar59._8_4_ = auVar102._8_4_ * auVar103._8_4_;
          auVar59._12_4_ = auVar102._12_4_ * auVar103._12_4_;
          auVar59._16_4_ = auVar102._16_4_ * auVar103._16_4_;
          auVar59._20_4_ = auVar102._20_4_ * auVar103._20_4_;
          auVar59._24_4_ = auVar102._24_4_ * auVar103._24_4_;
          auVar59._28_4_ = auVar103._28_4_;
          auVar103 = vmulps_avx512vl(auVar102,auVar106);
          auVar9 = vfmadd213ps_fma(auVar55,auVar108,ZEXT1632(auVar90));
          auVar10 = vfmadd213ps_fma(auVar56,auVar108,ZEXT1632(auVar91));
          auVar114 = vfmadd213ps_avx512vl(auVar113,auVar108,auVar105);
          auVar112 = vfmadd213ps_avx512vl(auVar58,auVar101,ZEXT1632(auVar94));
          auVar152 = vfnmadd213ps_fma(auVar55,auVar108,ZEXT1632(auVar90));
          auVar90 = vfmadd213ps_fma(auVar59,auVar101,ZEXT1632(auVar8));
          auVar172 = vfnmadd213ps_fma(auVar56,auVar108,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar103,auVar101,auVar104);
          auVar96 = vfnmadd231ps_fma(auVar105,auVar108,auVar113);
          auVar93 = vfnmadd213ps_fma(auVar58,auVar101,ZEXT1632(auVar94));
          auVar95 = vfnmadd213ps_fma(auVar59,auVar101,ZEXT1632(auVar8));
          auVar97 = vfnmadd231ps_fma(auVar104,auVar101,auVar103);
          auVar104 = vsubps_avx512vl(auVar112,ZEXT1632(auVar152));
          auVar103 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar172));
          auVar102 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar96));
          auVar60._4_4_ = auVar103._4_4_ * auVar96._4_4_;
          auVar60._0_4_ = auVar103._0_4_ * auVar96._0_4_;
          auVar60._8_4_ = auVar103._8_4_ * auVar96._8_4_;
          auVar60._12_4_ = auVar103._12_4_ * auVar96._12_4_;
          auVar60._16_4_ = auVar103._16_4_ * 0.0;
          auVar60._20_4_ = auVar103._20_4_ * 0.0;
          auVar60._24_4_ = auVar103._24_4_ * 0.0;
          auVar60._28_4_ = auVar113._28_4_;
          auVar94 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar172),auVar102);
          auVar61._4_4_ = auVar102._4_4_ * auVar152._4_4_;
          auVar61._0_4_ = auVar102._0_4_ * auVar152._0_4_;
          auVar61._8_4_ = auVar102._8_4_ * auVar152._8_4_;
          auVar61._12_4_ = auVar102._12_4_ * auVar152._12_4_;
          auVar61._16_4_ = auVar102._16_4_ * 0.0;
          auVar61._20_4_ = auVar102._20_4_ * 0.0;
          auVar61._24_4_ = auVar102._24_4_ * 0.0;
          auVar61._28_4_ = auVar102._28_4_;
          auVar8 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar96),auVar104);
          auVar62._4_4_ = auVar172._4_4_ * auVar104._4_4_;
          auVar62._0_4_ = auVar172._0_4_ * auVar104._0_4_;
          auVar62._8_4_ = auVar172._8_4_ * auVar104._8_4_;
          auVar62._12_4_ = auVar172._12_4_ * auVar104._12_4_;
          auVar62._16_4_ = auVar104._16_4_ * 0.0;
          auVar62._20_4_ = auVar104._20_4_ * 0.0;
          auVar62._24_4_ = auVar104._24_4_ * 0.0;
          auVar62._28_4_ = auVar104._28_4_;
          auVar11 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar152),auVar103);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar106,ZEXT1632(auVar8));
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,ZEXT1632(auVar94));
          auVar99 = ZEXT1632(auVar98);
          uVar78 = vcmpps_avx512vl(auVar103,auVar99,2);
          bVar77 = (byte)uVar78;
          fVar141 = (float)((uint)(bVar77 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar77 & 1) * auVar93._0_4_);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          fVar143 = (float)((uint)bVar19 * auVar9._4_4_ | (uint)!bVar19 * auVar93._4_4_);
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          fVar146 = (float)((uint)bVar19 * auVar9._8_4_ | (uint)!bVar19 * auVar93._8_4_);
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          fVar147 = (float)((uint)bVar19 * auVar9._12_4_ | (uint)!bVar19 * auVar93._12_4_);
          auVar106 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar146,CONCAT44(fVar143,fVar141))));
          fVar142 = (float)((uint)(bVar77 & 1) * auVar10._0_4_ |
                           (uint)!(bool)(bVar77 & 1) * auVar95._0_4_);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          fVar145 = (float)((uint)bVar19 * auVar10._4_4_ | (uint)!bVar19 * auVar95._4_4_);
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          fVar144 = (float)((uint)bVar19 * auVar10._8_4_ | (uint)!bVar19 * auVar95._8_4_);
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          fVar148 = (float)((uint)bVar19 * auVar10._12_4_ | (uint)!bVar19 * auVar95._12_4_);
          auVar107 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar144,CONCAT44(fVar145,fVar142))));
          auVar131._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar114._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar97._0_4_);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar19 * auVar114._4_4_ | (uint)!bVar19 * auVar97._4_4_);
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar19 * auVar114._8_4_ | (uint)!bVar19 * auVar97._8_4_);
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar19 * auVar114._12_4_ | (uint)!bVar19 * auVar97._12_4_)
          ;
          fVar169 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar114._16_4_);
          auVar131._16_4_ = fVar169;
          fVar168 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar114._20_4_);
          auVar131._20_4_ = fVar168;
          fVar176 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar114._24_4_);
          auVar131._24_4_ = fVar176;
          iVar1 = (uint)(byte)(uVar78 >> 7) * auVar114._28_4_;
          auVar131._28_4_ = iVar1;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar152),auVar112);
          auVar132._0_4_ =
               (uint)(bVar77 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar94._0_4_;
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * auVar94._4_4_;
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * auVar94._8_4_;
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * auVar94._12_4_;
          auVar132._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar103._16_4_;
          auVar132._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar103._20_4_;
          auVar132._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar103._24_4_;
          auVar132._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar172),ZEXT1632(auVar90));
          auVar133._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar9._0_4_);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * auVar9._4_4_);
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * auVar9._8_4_);
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar133._12_4_ = (float)((uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * auVar9._12_4_);
          fVar183 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar103._16_4_);
          auVar133._16_4_ = fVar183;
          fVar175 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar103._20_4_);
          auVar133._20_4_ = fVar175;
          fVar170 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar103._24_4_);
          auVar133._24_4_ = fVar170;
          auVar133._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar91));
          auVar134._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar10._0_4_);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * auVar10._4_4_);
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * auVar10._8_4_);
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar134._12_4_ = (float)((uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * auVar10._12_4_)
          ;
          fVar140 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar103._16_4_);
          auVar134._16_4_ = fVar140;
          fVar89 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar103._20_4_);
          auVar134._20_4_ = fVar89;
          fVar88 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar103._24_4_);
          auVar134._24_4_ = fVar88;
          iVar2 = (uint)(byte)(uVar78 >> 7) * auVar103._28_4_;
          auVar134._28_4_ = iVar2;
          auVar135._0_4_ =
               (uint)(bVar77 & 1) * (int)auVar152._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar112._0_4_
          ;
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar19 * (int)auVar152._4_4_ | (uint)!bVar19 * auVar112._4_4_;
          bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar19 * (int)auVar152._8_4_ | (uint)!bVar19 * auVar112._8_4_;
          bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar19 * (int)auVar152._12_4_ | (uint)!bVar19 * auVar112._12_4_;
          auVar135._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar112._16_4_;
          auVar135._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar112._20_4_;
          auVar135._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar112._24_4_;
          auVar135._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar112._28_4_;
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar78 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar78 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar78 >> 1) & 1);
          bVar22 = (bool)((byte)(uVar78 >> 2) & 1);
          bVar24 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar112 = vsubps_avx512vl(auVar135,auVar106);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar172._12_4_ |
                                                   (uint)!bVar23 * auVar90._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar172._8_4_ |
                                                            (uint)!bVar21 * auVar90._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar172._4_4_ |
                                                                     (uint)!bVar19 * auVar90._4_4_,
                                                                     (uint)(bVar77 & 1) *
                                                                     (int)auVar172._0_4_ |
                                                                     (uint)!(bool)(bVar77 & 1) *
                                                                     auVar90._0_4_)))),auVar107);
          auVar206 = ZEXT3264(auVar102);
          auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar96._12_4_ |
                                                   (uint)!bVar24 * auVar91._12_4_,
                                                   CONCAT48((uint)bVar22 * (int)auVar96._8_4_ |
                                                            (uint)!bVar22 * auVar91._8_4_,
                                                            CONCAT44((uint)bVar20 *
                                                                     (int)auVar96._4_4_ |
                                                                     (uint)!bVar20 * auVar91._4_4_,
                                                                     (uint)(bVar77 & 1) *
                                                                     (int)auVar96._0_4_ |
                                                                     (uint)!(bool)(bVar77 & 1) *
                                                                     auVar91._0_4_)))),auVar131);
          auVar113 = vsubps_avx(auVar106,auVar132);
          auVar210 = ZEXT3264(auVar113);
          auVar104 = vsubps_avx(auVar107,auVar133);
          auVar105 = vsubps_avx(auVar131,auVar134);
          auVar63._4_4_ = auVar114._4_4_ * fVar143;
          auVar63._0_4_ = auVar114._0_4_ * fVar141;
          auVar63._8_4_ = auVar114._8_4_ * fVar146;
          auVar63._12_4_ = auVar114._12_4_ * fVar147;
          auVar63._16_4_ = auVar114._16_4_ * 0.0;
          auVar63._20_4_ = auVar114._20_4_ * 0.0;
          auVar63._24_4_ = auVar114._24_4_ * 0.0;
          auVar63._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar63,auVar131,auVar112);
          auVar189._0_4_ = fVar142 * auVar112._0_4_;
          auVar189._4_4_ = fVar145 * auVar112._4_4_;
          auVar189._8_4_ = fVar144 * auVar112._8_4_;
          auVar189._12_4_ = fVar148 * auVar112._12_4_;
          auVar189._16_4_ = auVar112._16_4_ * 0.0;
          auVar189._20_4_ = auVar112._20_4_ * 0.0;
          auVar189._24_4_ = auVar112._24_4_ * 0.0;
          auVar189._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar189,auVar106,auVar102);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar99,ZEXT1632(auVar90));
          auVar192._0_4_ = auVar102._0_4_ * auVar131._0_4_;
          auVar192._4_4_ = auVar102._4_4_ * auVar131._4_4_;
          auVar192._8_4_ = auVar102._8_4_ * auVar131._8_4_;
          auVar192._12_4_ = auVar102._12_4_ * auVar131._12_4_;
          auVar192._16_4_ = auVar102._16_4_ * fVar169;
          auVar192._20_4_ = auVar102._20_4_ * fVar168;
          auVar192._24_4_ = auVar102._24_4_ * fVar176;
          auVar192._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar192,auVar107,auVar114);
          auVar109 = vfmadd231ps_avx512vl(auVar103,auVar99,ZEXT1632(auVar90));
          auVar103 = vmulps_avx512vl(auVar105,auVar132);
          auVar103 = vfmsub231ps_avx512vl(auVar103,auVar113,auVar134);
          auVar64._4_4_ = auVar104._4_4_ * auVar134._4_4_;
          auVar64._0_4_ = auVar104._0_4_ * auVar134._0_4_;
          auVar64._8_4_ = auVar104._8_4_ * auVar134._8_4_;
          auVar64._12_4_ = auVar104._12_4_ * auVar134._12_4_;
          auVar64._16_4_ = auVar104._16_4_ * fVar140;
          auVar64._20_4_ = auVar104._20_4_ * fVar89;
          auVar64._24_4_ = auVar104._24_4_ * fVar88;
          auVar64._28_4_ = iVar2;
          auVar90 = vfmsub231ps_fma(auVar64,auVar133,auVar105);
          auVar193._0_4_ = auVar133._0_4_ * auVar113._0_4_;
          auVar193._4_4_ = auVar133._4_4_ * auVar113._4_4_;
          auVar193._8_4_ = auVar133._8_4_ * auVar113._8_4_;
          auVar193._12_4_ = auVar133._12_4_ * auVar113._12_4_;
          auVar193._16_4_ = fVar183 * auVar113._16_4_;
          auVar193._20_4_ = fVar175 * auVar113._20_4_;
          auVar193._24_4_ = fVar170 * auVar113._24_4_;
          auVar193._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar193,auVar104,auVar132);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar99,auVar103);
          auVar110 = vfmadd231ps_avx512vl(auVar103,auVar99,ZEXT1632(auVar90));
          auVar196 = ZEXT3264(auVar110);
          auVar103 = vmaxps_avx(auVar109,auVar110);
          uVar171 = vcmpps_avx512vl(auVar103,auVar99,2);
          bVar86 = bVar86 & (byte)uVar171;
          if (bVar86 != 0) {
            uVar151 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar226._4_4_ = uVar151;
            auVar226._0_4_ = uVar151;
            auVar226._8_4_ = uVar151;
            auVar226._12_4_ = uVar151;
            auVar226._16_4_ = uVar151;
            auVar226._20_4_ = uVar151;
            auVar226._24_4_ = uVar151;
            auVar226._28_4_ = uVar151;
            auVar227 = ZEXT3264(auVar226);
            auVar65._4_4_ = auVar105._4_4_ * auVar102._4_4_;
            auVar65._0_4_ = auVar105._0_4_ * auVar102._0_4_;
            auVar65._8_4_ = auVar105._8_4_ * auVar102._8_4_;
            auVar65._12_4_ = auVar105._12_4_ * auVar102._12_4_;
            auVar65._16_4_ = auVar105._16_4_ * auVar102._16_4_;
            auVar65._20_4_ = auVar105._20_4_ * auVar102._20_4_;
            auVar65._24_4_ = auVar105._24_4_ * auVar102._24_4_;
            auVar65._28_4_ = auVar103._28_4_;
            auVar8 = vfmsub231ps_fma(auVar65,auVar104,auVar114);
            auVar66._4_4_ = auVar114._4_4_ * auVar113._4_4_;
            auVar66._0_4_ = auVar114._0_4_ * auVar113._0_4_;
            auVar66._8_4_ = auVar114._8_4_ * auVar113._8_4_;
            auVar66._12_4_ = auVar114._12_4_ * auVar113._12_4_;
            auVar66._16_4_ = auVar114._16_4_ * auVar113._16_4_;
            auVar66._20_4_ = auVar114._20_4_ * auVar113._20_4_;
            auVar66._24_4_ = auVar114._24_4_ * auVar113._24_4_;
            auVar66._28_4_ = auVar114._28_4_;
            auVar94 = vfmsub231ps_fma(auVar66,auVar112,auVar105);
            auVar67._4_4_ = auVar104._4_4_ * auVar112._4_4_;
            auVar67._0_4_ = auVar104._0_4_ * auVar112._0_4_;
            auVar67._8_4_ = auVar104._8_4_ * auVar112._8_4_;
            auVar67._12_4_ = auVar104._12_4_ * auVar112._12_4_;
            auVar67._16_4_ = auVar104._16_4_ * auVar112._16_4_;
            auVar67._20_4_ = auVar104._20_4_ * auVar112._20_4_;
            auVar67._24_4_ = auVar104._24_4_ * auVar112._24_4_;
            auVar67._28_4_ = auVar104._28_4_;
            auVar9 = vfmsub231ps_fma(auVar67,auVar113,auVar102);
            auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar9));
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT1632(auVar8),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar91));
            auVar102 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar91),auVar100);
            auVar90 = vfmadd132ps_fma(auVar102,auVar103,auVar103);
            auVar206 = ZEXT1664(auVar90);
            auVar68._4_4_ = auVar9._4_4_ * auVar131._4_4_;
            auVar68._0_4_ = auVar9._0_4_ * auVar131._0_4_;
            auVar68._8_4_ = auVar9._8_4_ * auVar131._8_4_;
            auVar68._12_4_ = auVar9._12_4_ * auVar131._12_4_;
            auVar68._16_4_ = fVar169 * 0.0;
            auVar68._20_4_ = fVar168 * 0.0;
            auVar68._24_4_ = fVar176 * 0.0;
            auVar68._28_4_ = iVar1;
            auVar94 = vfmadd231ps_fma(auVar68,auVar107,ZEXT1632(auVar94));
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,ZEXT1632(auVar8));
            fVar176 = auVar90._0_4_;
            fVar168 = auVar90._4_4_;
            fVar169 = auVar90._8_4_;
            fVar170 = auVar90._12_4_;
            local_5e0._28_4_ = auVar103._28_4_;
            local_5e0._0_28_ =
                 ZEXT1628(CONCAT412(auVar94._12_4_ * fVar170,
                                    CONCAT48(auVar94._8_4_ * fVar169,
                                             CONCAT44(auVar94._4_4_ * fVar168,
                                                      auVar94._0_4_ * fVar176))));
            auVar210 = ZEXT3264(local_5e0);
            uVar171 = vcmpps_avx512vl(local_5e0,auVar226,2);
            auVar75._4_4_ = uStack_55c;
            auVar75._0_4_ = local_560;
            auVar75._8_4_ = uStack_558;
            auVar75._12_4_ = uStack_554;
            auVar75._16_4_ = uStack_550;
            auVar75._20_4_ = uStack_54c;
            auVar75._24_4_ = uStack_548;
            auVar75._28_4_ = uStack_544;
            uVar27 = vcmpps_avx512vl(local_5e0,auVar75,0xd);
            bVar86 = (byte)uVar171 & (byte)uVar27 & bVar86;
            if (bVar86 != 0) {
              uVar87 = vcmpps_avx512vl(ZEXT1632(auVar91),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar87 = bVar86 & uVar87;
              if ((char)uVar87 != '\0') {
                fVar175 = auVar109._0_4_ * fVar176;
                fVar183 = auVar109._4_4_ * fVar168;
                auVar69._4_4_ = fVar183;
                auVar69._0_4_ = fVar175;
                fVar88 = auVar109._8_4_ * fVar169;
                auVar69._8_4_ = fVar88;
                fVar89 = auVar109._12_4_ * fVar170;
                auVar69._12_4_ = fVar89;
                fVar140 = auVar109._16_4_ * 0.0;
                auVar69._16_4_ = fVar140;
                fVar141 = auVar109._20_4_ * 0.0;
                auVar69._20_4_ = fVar141;
                fVar142 = auVar109._24_4_ * 0.0;
                auVar69._24_4_ = fVar142;
                auVar69._28_4_ = auVar109._28_4_;
                auVar103 = vsubps_avx512vl(auVar100,auVar69);
                local_3e0._0_4_ =
                     (float)((uint)(bVar77 & 1) * (int)fVar175 |
                            (uint)!(bool)(bVar77 & 1) * auVar103._0_4_);
                bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
                local_3e0._4_4_ =
                     (float)((uint)bVar19 * (int)fVar183 | (uint)!bVar19 * auVar103._4_4_);
                bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
                local_3e0._8_4_ =
                     (float)((uint)bVar19 * (int)fVar88 | (uint)!bVar19 * auVar103._8_4_);
                bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
                local_3e0._12_4_ =
                     (float)((uint)bVar19 * (int)fVar89 | (uint)!bVar19 * auVar103._12_4_);
                bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
                local_3e0._16_4_ =
                     (float)((uint)bVar19 * (int)fVar140 | (uint)!bVar19 * auVar103._16_4_);
                bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
                local_3e0._20_4_ =
                     (float)((uint)bVar19 * (int)fVar141 | (uint)!bVar19 * auVar103._20_4_);
                bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
                local_3e0._24_4_ =
                     (float)((uint)bVar19 * (int)fVar142 | (uint)!bVar19 * auVar103._24_4_);
                bVar19 = SUB81(uVar78 >> 7,0);
                local_3e0._28_4_ =
                     (float)((uint)bVar19 * auVar109._28_4_ | (uint)!bVar19 * auVar103._28_4_);
                auVar103 = vsubps_avx(auVar101,auVar108);
                auVar90 = vfmadd213ps_fma(auVar103,local_3e0,auVar108);
                uVar151 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar32._4_4_ = uVar151;
                auVar32._0_4_ = uVar151;
                auVar32._8_4_ = uVar151;
                auVar32._12_4_ = uVar151;
                auVar32._16_4_ = uVar151;
                auVar32._20_4_ = uVar151;
                auVar32._24_4_ = uVar151;
                auVar32._28_4_ = uVar151;
                auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                              CONCAT48(auVar90._8_4_ + auVar90._8_4_
                                                                       ,CONCAT44(auVar90._4_4_ +
                                                                                 auVar90._4_4_,
                                                                                 auVar90._0_4_ +
                                                                                 auVar90._0_4_)))),
                                           auVar32);
                uVar26 = vcmpps_avx512vl(local_5e0,auVar103,6);
                uVar87 = uVar87 & uVar26;
                bVar86 = (byte)uVar87;
                if (bVar86 != 0) {
                  auVar174._0_4_ = auVar110._0_4_ * fVar176;
                  auVar174._4_4_ = auVar110._4_4_ * fVar168;
                  auVar174._8_4_ = auVar110._8_4_ * fVar169;
                  auVar174._12_4_ = auVar110._12_4_ * fVar170;
                  auVar174._16_4_ = auVar110._16_4_ * 0.0;
                  auVar174._20_4_ = auVar110._20_4_ * 0.0;
                  auVar174._24_4_ = auVar110._24_4_ * 0.0;
                  auVar174._28_4_ = 0;
                  auVar103 = vsubps_avx512vl(auVar100,auVar174);
                  auVar136._0_4_ =
                       (uint)(bVar77 & 1) * (int)auVar174._0_4_ |
                       (uint)!(bool)(bVar77 & 1) * auVar103._0_4_;
                  bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
                  auVar136._4_4_ =
                       (uint)bVar19 * (int)auVar174._4_4_ | (uint)!bVar19 * auVar103._4_4_;
                  bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
                  auVar136._8_4_ =
                       (uint)bVar19 * (int)auVar174._8_4_ | (uint)!bVar19 * auVar103._8_4_;
                  bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
                  auVar136._12_4_ =
                       (uint)bVar19 * (int)auVar174._12_4_ | (uint)!bVar19 * auVar103._12_4_;
                  bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
                  auVar136._16_4_ =
                       (uint)bVar19 * (int)auVar174._16_4_ | (uint)!bVar19 * auVar103._16_4_;
                  bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
                  auVar136._20_4_ =
                       (uint)bVar19 * (int)auVar174._20_4_ | (uint)!bVar19 * auVar103._20_4_;
                  bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
                  auVar136._24_4_ =
                       (uint)bVar19 * (int)auVar174._24_4_ | (uint)!bVar19 * auVar103._24_4_;
                  auVar136._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar103._28_4_;
                  auVar33._8_4_ = 0x40000000;
                  auVar33._0_8_ = 0x4000000040000000;
                  auVar33._12_4_ = 0x40000000;
                  auVar33._16_4_ = 0x40000000;
                  auVar33._20_4_ = 0x40000000;
                  auVar33._24_4_ = 0x40000000;
                  auVar33._28_4_ = 0x40000000;
                  local_3c0 = vfmsub132ps_avx512vl(auVar136,auVar100,auVar33);
                  local_380 = (undefined4)lVar81;
                  local_370 = local_670;
                  uStack_368 = uStack_668;
                  local_360 = local_680;
                  uStack_358 = uStack_678;
                  local_350 = local_690;
                  uStack_348 = uStack_688;
                  local_340 = local_6a0;
                  uStack_338 = uStack_698;
                  pGVar83 = (context->scene->geometries).items[uVar84].ptr;
                  if ((pGVar83->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar90 = vcvtsi2ss_avx512f(auVar98,local_380);
                    fVar176 = auVar90._0_4_;
                    local_320[0] = (fVar176 + local_3e0._0_4_ + 0.0) * local_100;
                    local_320[1] = (fVar176 + local_3e0._4_4_ + 1.0) * fStack_fc;
                    local_320[2] = (fVar176 + local_3e0._8_4_ + 2.0) * fStack_f8;
                    local_320[3] = (fVar176 + local_3e0._12_4_ + 3.0) * fStack_f4;
                    fStack_310 = (fVar176 + local_3e0._16_4_ + 4.0) * fStack_f0;
                    fStack_30c = (fVar176 + local_3e0._20_4_ + 5.0) * fStack_ec;
                    fStack_308 = (fVar176 + local_3e0._24_4_ + 6.0) * fStack_e8;
                    fStack_304 = fVar176 + local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_5e0;
                    auVar161._8_4_ = 0x7f800000;
                    auVar161._0_8_ = 0x7f8000007f800000;
                    auVar161._12_4_ = 0x7f800000;
                    auVar161._16_4_ = 0x7f800000;
                    auVar161._20_4_ = 0x7f800000;
                    auVar161._24_4_ = 0x7f800000;
                    auVar161._28_4_ = 0x7f800000;
                    auVar103 = vblendmps_avx512vl(auVar161,local_5e0);
                    auVar137._0_4_ =
                         (uint)(bVar86 & 1) * auVar103._0_4_ |
                         (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar137._4_4_ = (uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar137._8_4_ = (uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar137._12_4_ = (uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar137._16_4_ = (uint)bVar19 * auVar103._16_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar137._20_4_ = (uint)bVar19 * auVar103._20_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar137._24_4_ = (uint)bVar19 * auVar103._24_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = SUB81(uVar87 >> 7,0);
                    auVar137._28_4_ = (uint)bVar19 * auVar103._28_4_ | (uint)!bVar19 * 0x7f800000;
                    auVar103 = vshufps_avx(auVar137,auVar137,0xb1);
                    auVar103 = vminps_avx(auVar137,auVar103);
                    auVar102 = vshufpd_avx(auVar103,auVar103,5);
                    auVar103 = vminps_avx(auVar103,auVar102);
                    auVar102 = vpermpd_avx2(auVar103,0x4e);
                    auVar103 = vminps_avx(auVar103,auVar102);
                    uVar171 = vcmpps_avx512vl(auVar137,auVar103,0);
                    uVar79 = (uint)uVar87;
                    if (((byte)uVar171 & bVar86) != 0) {
                      uVar79 = (uint)((byte)uVar171 & bVar86);
                    }
                    uVar80 = 0;
                    for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                      uVar80 = uVar80 + 1;
                    }
                    uVar78 = (ulong)uVar80;
                    pGVar76 = pGVar83;
                    local_3a0 = local_5e0;
                    local_37c = iVar14;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_630 = pGVar76;
                        local_1c0 = local_320[uVar78];
                        local_1a0 = *(undefined4 *)(local_300 + uVar78 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + uVar78 * 4);
                        local_660.context = context->user;
                        fVar168 = 1.0 - local_1c0;
                        fVar176 = fVar168 * fVar168 * -3.0;
                        auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar168 * fVar168)),
                                                  ZEXT416((uint)(local_1c0 * fVar168)),
                                                  ZEXT416(0xc0000000));
                        auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar168)),
                                                  ZEXT416((uint)(local_1c0 * local_1c0)),
                                                  ZEXT416(0x40000000));
                        fVar168 = auVar90._0_4_ * 3.0;
                        fVar169 = auVar91._0_4_ * 3.0;
                        fVar170 = local_1c0 * local_1c0 * 3.0;
                        auVar199._0_4_ = fVar170 * fVar149;
                        auVar199._4_4_ = fVar170 * fVar150;
                        auVar199._8_4_ = fVar170 * fVar166;
                        auVar199._12_4_ = fVar170 * fVar167;
                        auVar153._4_4_ = fVar169;
                        auVar153._0_4_ = fVar169;
                        auVar153._8_4_ = fVar169;
                        auVar153._12_4_ = fVar169;
                        auVar90 = vfmadd132ps_fma(auVar153,auVar199,auVar92);
                        auVar187._4_4_ = fVar168;
                        auVar187._0_4_ = fVar168;
                        auVar187._8_4_ = fVar168;
                        auVar187._12_4_ = fVar168;
                        auVar90 = vfmadd132ps_fma(auVar187,auVar90,auVar7);
                        auVar154._4_4_ = fVar176;
                        auVar154._0_4_ = fVar176;
                        auVar154._8_4_ = fVar176;
                        auVar154._12_4_ = fVar176;
                        auVar90 = vfmadd132ps_fma(auVar154,auVar90,auVar6);
                        local_220 = auVar90._0_4_;
                        auVar194._8_4_ = 1;
                        auVar194._0_8_ = 0x100000001;
                        auVar194._12_4_ = 1;
                        auVar194._16_4_ = 1;
                        auVar194._20_4_ = 1;
                        auVar194._24_4_ = 1;
                        auVar194._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar194,ZEXT1632(auVar90));
                        auVar196 = ZEXT3264(local_200);
                        auVar200._8_4_ = 2;
                        auVar200._0_8_ = 0x200000002;
                        auVar200._12_4_ = 2;
                        auVar204._16_4_ = 2;
                        auVar204._0_16_ = auVar200;
                        auVar204._20_4_ = 2;
                        auVar204._24_4_ = 2;
                        auVar204._28_4_ = 2;
                        auVar206 = ZEXT3264(auVar204);
                        local_1e0 = vpermps_avx2(auVar204,ZEXT1632(auVar90));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_520._0_8_;
                        uStack_178 = local_520._8_8_;
                        uStack_170 = local_520._16_8_;
                        uStack_168 = local_520._24_8_;
                        local_160 = local_580;
                        auVar103 = vpcmpeqd_avx2(local_580,local_580);
                        local_628[1] = auVar103;
                        *local_628 = auVar103;
                        local_140 = (local_660.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_660.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_620 = local_2c0;
                        local_660.valid = (int *)local_620;
                        local_660.geometryUserPtr = pGVar83->userPtr;
                        local_660.hit = (RTCHitN *)&local_220;
                        local_660.N = 8;
                        local_5c0 = auVar227._0_32_;
                        local_660.ray = (RTCRayN *)ray;
                        if (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar196 = ZEXT1664(local_200._0_16_);
                          auVar206 = ZEXT1664(auVar200);
                          (*pGVar83->intersectionFilterN)(&local_660);
                          auVar210 = ZEXT3264(local_5e0);
                          auVar227 = ZEXT3264(local_5c0);
                          pGVar83 = local_630;
                        }
                        if (local_620 == (undefined1  [32])0x0) {
LAB_01dd9f84:
                          *(int *)(ray + k * 4 + 0x100) = auVar227._0_4_;
                        }
                        else {
                          p_Var18 = context->args->filter;
                          if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar83->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar196 = ZEXT1664(auVar196._0_16_);
                            auVar206 = ZEXT1664(auVar206._0_16_);
                            (*p_Var18)(&local_660);
                            auVar210 = ZEXT3264(local_5e0);
                            auVar227 = ZEXT3264(local_5c0);
                            pGVar83 = local_630;
                          }
                          if (local_620 == (undefined1  [32])0x0) goto LAB_01dd9f84;
                          uVar26 = vptestmd_avx512vl(local_620,local_620);
                          iVar1 = *(int *)(local_660.hit + 4);
                          iVar2 = *(int *)(local_660.hit + 8);
                          iVar70 = *(int *)(local_660.hit + 0xc);
                          iVar71 = *(int *)(local_660.hit + 0x10);
                          iVar72 = *(int *)(local_660.hit + 0x14);
                          iVar73 = *(int *)(local_660.hit + 0x18);
                          iVar74 = *(int *)(local_660.hit + 0x1c);
                          bVar86 = (byte)uVar26;
                          bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar25 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_660.ray + 0x180) =
                               (uint)(bVar86 & 1) * *(int *)local_660.hit |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x180);
                          *(uint *)(local_660.ray + 0x184) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x184);
                          *(uint *)(local_660.ray + 0x188) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x188);
                          *(uint *)(local_660.ray + 0x18c) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_660.ray + 0x18c);
                          *(uint *)(local_660.ray + 400) =
                               (uint)bVar22 * iVar71 | (uint)!bVar22 * *(int *)(local_660.ray + 400)
                          ;
                          *(uint *)(local_660.ray + 0x194) =
                               (uint)bVar23 * iVar72 |
                               (uint)!bVar23 * *(int *)(local_660.ray + 0x194);
                          *(uint *)(local_660.ray + 0x198) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x198);
                          *(uint *)(local_660.ray + 0x19c) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_660.ray + 0x19c);
                          iVar1 = *(int *)(local_660.hit + 0x24);
                          iVar2 = *(int *)(local_660.hit + 0x28);
                          iVar70 = *(int *)(local_660.hit + 0x2c);
                          iVar71 = *(int *)(local_660.hit + 0x30);
                          iVar72 = *(int *)(local_660.hit + 0x34);
                          iVar73 = *(int *)(local_660.hit + 0x38);
                          iVar74 = *(int *)(local_660.hit + 0x3c);
                          bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar25 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_660.ray + 0x1a0) =
                               (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x20) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1a0);
                          *(uint *)(local_660.ray + 0x1a4) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1a4);
                          *(uint *)(local_660.ray + 0x1a8) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x1a8);
                          *(uint *)(local_660.ray + 0x1ac) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_660.ray + 0x1ac);
                          *(uint *)(local_660.ray + 0x1b0) =
                               (uint)bVar22 * iVar71 |
                               (uint)!bVar22 * *(int *)(local_660.ray + 0x1b0);
                          *(uint *)(local_660.ray + 0x1b4) =
                               (uint)bVar23 * iVar72 |
                               (uint)!bVar23 * *(int *)(local_660.ray + 0x1b4);
                          *(uint *)(local_660.ray + 0x1b8) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x1b8);
                          *(uint *)(local_660.ray + 0x1bc) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_660.ray + 0x1bc);
                          iVar1 = *(int *)(local_660.hit + 0x44);
                          iVar2 = *(int *)(local_660.hit + 0x48);
                          iVar70 = *(int *)(local_660.hit + 0x4c);
                          iVar71 = *(int *)(local_660.hit + 0x50);
                          iVar72 = *(int *)(local_660.hit + 0x54);
                          iVar73 = *(int *)(local_660.hit + 0x58);
                          iVar74 = *(int *)(local_660.hit + 0x5c);
                          bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar25 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_660.ray + 0x1c0) =
                               (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x40) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1c0);
                          *(uint *)(local_660.ray + 0x1c4) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1c4);
                          *(uint *)(local_660.ray + 0x1c8) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x1c8);
                          *(uint *)(local_660.ray + 0x1cc) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_660.ray + 0x1cc);
                          *(uint *)(local_660.ray + 0x1d0) =
                               (uint)bVar22 * iVar71 |
                               (uint)!bVar22 * *(int *)(local_660.ray + 0x1d0);
                          *(uint *)(local_660.ray + 0x1d4) =
                               (uint)bVar23 * iVar72 |
                               (uint)!bVar23 * *(int *)(local_660.ray + 0x1d4);
                          *(uint *)(local_660.ray + 0x1d8) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x1d8);
                          *(uint *)(local_660.ray + 0x1dc) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_660.ray + 0x1dc);
                          iVar1 = *(int *)(local_660.hit + 100);
                          iVar2 = *(int *)(local_660.hit + 0x68);
                          iVar70 = *(int *)(local_660.hit + 0x6c);
                          iVar71 = *(int *)(local_660.hit + 0x70);
                          iVar72 = *(int *)(local_660.hit + 0x74);
                          iVar73 = *(int *)(local_660.hit + 0x78);
                          iVar74 = *(int *)(local_660.hit + 0x7c);
                          bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar25 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_660.ray + 0x1e0) =
                               (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x60) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1e0);
                          *(uint *)(local_660.ray + 0x1e4) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1e4);
                          *(uint *)(local_660.ray + 0x1e8) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x1e8);
                          *(uint *)(local_660.ray + 0x1ec) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_660.ray + 0x1ec);
                          *(uint *)(local_660.ray + 0x1f0) =
                               (uint)bVar22 * iVar71 |
                               (uint)!bVar22 * *(int *)(local_660.ray + 0x1f0);
                          *(uint *)(local_660.ray + 500) =
                               (uint)bVar23 * iVar72 | (uint)!bVar23 * *(int *)(local_660.ray + 500)
                          ;
                          *(uint *)(local_660.ray + 0x1f8) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x1f8);
                          *(uint *)(local_660.ray + 0x1fc) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_660.ray + 0x1fc);
                          iVar1 = *(int *)(local_660.hit + 0x84);
                          iVar2 = *(int *)(local_660.hit + 0x88);
                          iVar70 = *(int *)(local_660.hit + 0x8c);
                          iVar71 = *(int *)(local_660.hit + 0x90);
                          iVar72 = *(int *)(local_660.hit + 0x94);
                          iVar73 = *(int *)(local_660.hit + 0x98);
                          iVar74 = *(int *)(local_660.hit + 0x9c);
                          bVar19 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar25 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_660.ray + 0x200) =
                               (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x80) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x200);
                          *(uint *)(local_660.ray + 0x204) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x204);
                          *(uint *)(local_660.ray + 0x208) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x208);
                          *(uint *)(local_660.ray + 0x20c) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_660.ray + 0x20c);
                          *(uint *)(local_660.ray + 0x210) =
                               (uint)bVar22 * iVar71 |
                               (uint)!bVar22 * *(int *)(local_660.ray + 0x210);
                          *(uint *)(local_660.ray + 0x214) =
                               (uint)bVar23 * iVar72 |
                               (uint)!bVar23 * *(int *)(local_660.ray + 0x214);
                          *(uint *)(local_660.ray + 0x218) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x218);
                          *(uint *)(local_660.ray + 0x21c) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_660.ray + 0x21c);
                          auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar103;
                          auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar103;
                          auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar103;
                          auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_660.hit + 0x100));
                          *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar103;
                          auVar227 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                        }
                        bVar86 = ~(byte)(1 << ((uint)uVar78 & 0x1f)) & (byte)uVar87;
                        uVar151 = auVar227._0_4_;
                        auVar162._4_4_ = uVar151;
                        auVar162._0_4_ = uVar151;
                        auVar162._8_4_ = uVar151;
                        auVar162._12_4_ = uVar151;
                        auVar162._16_4_ = uVar151;
                        auVar162._20_4_ = uVar151;
                        auVar162._24_4_ = uVar151;
                        auVar162._28_4_ = uVar151;
                        uVar171 = vcmpps_avx512vl(auVar210._0_32_,auVar162,2);
                        if ((bVar86 & (byte)uVar171) == 0) goto LAB_01dda013;
                        bVar86 = bVar86 & (byte)uVar171;
                        uVar87 = (ulong)bVar86;
                        auVar163._8_4_ = 0x7f800000;
                        auVar163._0_8_ = 0x7f8000007f800000;
                        auVar163._12_4_ = 0x7f800000;
                        auVar163._16_4_ = 0x7f800000;
                        auVar163._20_4_ = 0x7f800000;
                        auVar163._24_4_ = 0x7f800000;
                        auVar163._28_4_ = 0x7f800000;
                        auVar103 = vblendmps_avx512vl(auVar163,auVar210._0_32_);
                        auVar138._0_4_ =
                             (uint)(bVar86 & 1) * auVar103._0_4_ |
                             (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                        bVar19 = (bool)(bVar86 >> 1 & 1);
                        auVar138._4_4_ = (uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar86 >> 2 & 1);
                        auVar138._8_4_ = (uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar86 >> 3 & 1);
                        auVar138._12_4_ =
                             (uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar86 >> 4 & 1);
                        auVar138._16_4_ =
                             (uint)bVar19 * auVar103._16_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar86 >> 5 & 1);
                        auVar138._20_4_ =
                             (uint)bVar19 * auVar103._20_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar86 >> 6 & 1);
                        auVar138._24_4_ =
                             (uint)bVar19 * auVar103._24_4_ | (uint)!bVar19 * 0x7f800000;
                        auVar138._28_4_ =
                             (uint)(bVar86 >> 7) * auVar103._28_4_ |
                             (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                        auVar103 = vshufps_avx(auVar138,auVar138,0xb1);
                        auVar103 = vminps_avx(auVar138,auVar103);
                        auVar102 = vshufpd_avx(auVar103,auVar103,5);
                        auVar103 = vminps_avx(auVar103,auVar102);
                        auVar102 = vpermpd_avx2(auVar103,0x4e);
                        auVar103 = vminps_avx(auVar103,auVar102);
                        uVar171 = vcmpps_avx512vl(auVar138,auVar103,0);
                        bVar77 = (byte)uVar171 & bVar86;
                        if (bVar77 != 0) {
                          bVar86 = bVar77;
                        }
                        uVar79 = 0;
                        for (uVar80 = (uint)bVar86; (uVar80 & 1) == 0;
                            uVar80 = uVar80 >> 1 | 0x80000000) {
                          uVar79 = uVar79 + 1;
                        }
                        uVar78 = (ulong)uVar79;
                        pGVar76 = local_630;
                      } while( true );
                    }
                    fVar176 = local_320[uVar78];
                    uVar151 = *(undefined4 *)(local_300 + uVar78 * 4);
                    fVar169 = 1.0 - fVar176;
                    fVar168 = fVar169 * fVar169 * -3.0;
                    auVar196 = ZEXT464((uint)fVar168);
                    auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 * fVar169)),
                                              ZEXT416((uint)(fVar176 * fVar169)),ZEXT416(0xc0000000)
                                             );
                    auVar91 = vfmsub132ss_fma(ZEXT416((uint)(fVar176 * fVar169)),
                                              ZEXT416((uint)(fVar176 * fVar176)),ZEXT416(0x40000000)
                                             );
                    fVar169 = auVar90._0_4_ * 3.0;
                    fVar170 = auVar91._0_4_ * 3.0;
                    fVar175 = fVar176 * fVar176 * 3.0;
                    auVar198._0_4_ = fVar175 * fVar149;
                    auVar198._4_4_ = fVar175 * fVar150;
                    auVar198._8_4_ = fVar175 * fVar166;
                    auVar198._12_4_ = fVar175 * fVar167;
                    auVar206 = ZEXT1664(auVar198);
                    auVar179._4_4_ = fVar170;
                    auVar179._0_4_ = fVar170;
                    auVar179._8_4_ = fVar170;
                    auVar179._12_4_ = fVar170;
                    auVar90 = vfmadd132ps_fma(auVar179,auVar198,auVar92);
                    auVar186._4_4_ = fVar169;
                    auVar186._0_4_ = fVar169;
                    auVar186._8_4_ = fVar169;
                    auVar186._12_4_ = fVar169;
                    auVar90 = vfmadd132ps_fma(auVar186,auVar90,auVar7);
                    auVar180._4_4_ = fVar168;
                    auVar180._0_4_ = fVar168;
                    auVar180._8_4_ = fVar168;
                    auVar180._12_4_ = fVar168;
                    auVar90 = vfmadd132ps_fma(auVar180,auVar90,auVar6);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar78 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar90._0_4_;
                    uVar15 = vextractps_avx(auVar90,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar15;
                    uVar15 = vextractps_avx(auVar90,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar15;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar176;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar151;
                    *(uint *)(ray + k * 4 + 0x220) = uVar13;
                    *(uint *)(ray + k * 4 + 0x240) = uVar84;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01dd9c6a;
      }
LAB_01dd930a:
      uVar151 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar151;
      auVar31._0_4_ = uVar151;
      auVar31._8_4_ = uVar151;
      auVar31._12_4_ = uVar151;
      auVar31._16_4_ = uVar151;
      auVar31._20_4_ = uVar151;
      auVar31._24_4_ = uVar151;
      auVar31._28_4_ = uVar151;
      uVar171 = vcmpps_avx512vl(auVar228._0_32_,auVar31,2);
      uVar84 = (uint)uVar85 & (uint)uVar85 + 0xff & (uint)uVar171;
      uVar85 = (ulong)uVar84;
    } while (uVar84 != 0);
  }
  return;
LAB_01dda013:
  auVar228 = ZEXT3264(local_540);
  auVar229 = ZEXT464(0xbf800000);
  auVar90 = vxorps_avx512vl(auVar230._0_16_,auVar230._0_16_);
  auVar230 = ZEXT1664(auVar90);
LAB_01dd9c6a:
  lVar81 = lVar81 + 8;
  if (iVar14 <= (int)lVar81) goto LAB_01dd930a;
  goto LAB_01dd93b5;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }